

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PMP_Multilinear_64.h
# Opt level: O3

uint64_t __thiscall
PMP_Multilinear_Hasher_64::_hash_noRecursionNoInline_type2
          (PMP_Multilinear_Hasher_64 *this,uchar *chars,size_t cnt)

{
  int iVar1;
  int iVar2;
  random_data_for_PMPML_64 *prVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 auVar360 [16];
  undefined1 auVar361 [16];
  undefined1 auVar362 [16];
  undefined1 auVar363 [16];
  undefined1 auVar364 [16];
  undefined1 auVar365 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  undefined1 auVar373 [16];
  undefined1 auVar374 [16];
  undefined1 auVar375 [16];
  undefined1 auVar376 [16];
  undefined1 auVar377 [16];
  undefined1 auVar378 [16];
  undefined1 auVar379 [16];
  undefined1 auVar380 [16];
  undefined1 auVar381 [16];
  undefined1 auVar382 [16];
  undefined1 auVar383 [16];
  undefined1 auVar384 [16];
  undefined1 auVar385 [16];
  undefined1 auVar386 [16];
  undefined1 auVar387 [16];
  undefined1 auVar388 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar399 [16];
  undefined1 auVar400 [16];
  undefined1 auVar401 [16];
  undefined1 auVar402 [16];
  undefined1 auVar403 [16];
  undefined1 auVar404 [16];
  undefined1 auVar405 [16];
  undefined1 auVar406 [16];
  undefined1 auVar407 [16];
  undefined1 auVar408 [16];
  undefined1 auVar409 [16];
  undefined1 auVar410 [16];
  undefined1 auVar411 [16];
  undefined1 auVar412 [16];
  undefined1 auVar413 [16];
  undefined1 auVar414 [16];
  undefined1 auVar415 [16];
  undefined1 auVar416 [16];
  undefined1 auVar417 [16];
  undefined1 auVar418 [16];
  undefined1 auVar419 [16];
  undefined1 auVar420 [16];
  undefined1 auVar421 [16];
  undefined1 auVar422 [16];
  undefined1 auVar423 [16];
  undefined1 auVar424 [16];
  undefined1 auVar425 [16];
  undefined1 auVar426 [16];
  undefined1 auVar427 [16];
  undefined1 auVar428 [16];
  undefined1 auVar429 [16];
  undefined1 auVar430 [16];
  undefined1 auVar431 [16];
  undefined1 auVar432 [16];
  undefined1 auVar433 [16];
  undefined1 auVar434 [16];
  undefined1 auVar435 [16];
  undefined1 auVar436 [16];
  undefined1 auVar437 [16];
  undefined1 auVar438 [16];
  undefined1 auVar439 [16];
  undefined1 auVar440 [16];
  undefined1 auVar441 [16];
  undefined1 auVar442 [16];
  undefined1 auVar443 [16];
  undefined1 auVar444 [16];
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  undefined1 auVar447 [16];
  undefined1 auVar448 [16];
  undefined1 auVar449 [16];
  undefined1 auVar450 [16];
  undefined1 auVar451 [16];
  undefined1 auVar452 [16];
  undefined1 auVar453 [16];
  undefined1 auVar454 [16];
  undefined1 auVar455 [16];
  undefined1 auVar456 [16];
  undefined1 auVar457 [16];
  undefined1 auVar458 [16];
  undefined1 auVar459 [16];
  undefined1 auVar460 [16];
  undefined1 auVar461 [16];
  undefined1 auVar462 [16];
  undefined1 auVar463 [16];
  undefined1 auVar464 [16];
  undefined1 auVar465 [16];
  undefined1 auVar466 [16];
  undefined1 auVar467 [16];
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  undefined1 auVar470 [16];
  undefined1 auVar471 [16];
  undefined1 auVar472 [16];
  undefined1 auVar473 [16];
  undefined1 auVar474 [16];
  undefined1 auVar475 [16];
  undefined1 auVar476 [16];
  undefined1 auVar477 [16];
  undefined1 auVar478 [16];
  undefined1 auVar479 [16];
  undefined1 auVar480 [16];
  undefined1 auVar481 [16];
  undefined1 auVar482 [16];
  undefined1 auVar483 [16];
  undefined1 auVar484 [16];
  undefined1 auVar485 [16];
  undefined1 auVar486 [16];
  undefined1 auVar487 [16];
  undefined1 auVar488 [16];
  undefined1 auVar489 [16];
  undefined1 auVar490 [16];
  undefined1 auVar491 [16];
  undefined1 auVar492 [16];
  undefined1 auVar493 [16];
  undefined1 auVar494 [16];
  undefined1 auVar495 [16];
  undefined1 auVar496 [32];
  undefined1 auVar497 [32];
  undefined1 auVar498 [32];
  undefined1 auVar499 [16];
  long lVar500;
  ulong uVar501;
  ulong uVar502;
  ulong uVar503;
  int iVar504;
  ulong uVar505;
  ulong uVar506;
  ulong uVar507;
  ulong uVar508;
  ulong uVar509;
  ulong uVar510;
  ulong uVar511;
  ulong uVar512;
  ulong uVar513;
  ulong uVar514;
  ulong uVar515;
  ulong uVar516;
  ulong uVar517;
  ulong uVar518;
  ulong uVar519;
  ulong uVar520;
  ulong uVar521;
  ulong uVar522;
  ulong uVar523;
  ulong uVar524;
  ulong uVar525;
  ulong uVar526;
  ulong uVar527;
  uchar *puVar528;
  ulong *puVar529;
  long *plVar530;
  uint uVar531;
  long lVar532;
  ulong uVar533;
  ulong uVar534;
  ulong uVar535;
  ulong uVar536;
  ulong uVar537;
  ulong uVar538;
  ulong uVar539;
  uint uVar540;
  uint uVar541;
  long lVar542;
  long lVar543;
  long lVar544;
  int iVar545;
  ulong uVar546;
  uint uVar547;
  ulong uVar548;
  bool bVar549;
  undefined1 auVar550 [64];
  undefined1 auVar551 [64];
  undefined1 auVar552 [64];
  undefined1 auVar553 [64];
  undefined1 auVar554 [64];
  undefined1 auVar555 [64];
  undefined1 auVar556 [32];
  undefined1 auVar557 [32];
  undefined1 auVar558 [32];
  undefined1 auVar559 [32];
  undefined1 auVar560 [32];
  undefined1 auVar561 [32];
  undefined1 auVar562 [32];
  undefined1 auVar563 [32];
  undefined1 auVar564 [32];
  undefined1 auVar565 [32];
  _ULARGELARGE_INTEGER__XX allValues [1024];
  long local_4718;
  ulong local_4710;
  ulong local_4708;
  ulong local_4700;
  ulong local_46f0;
  long local_46d8;
  long local_46c0;
  ulong auStack_46b8 [8];
  ulong local_4678;
  ulong local_4670;
  ulong local_4668;
  ulong local_4660;
  ulong local_4658;
  ulong local_4650;
  ulong local_4648;
  ulong local_4640;
  ulong local_4638;
  ulong local_4630;
  ulong local_4628;
  ulong local_4620;
  ulong local_4618;
  ulong local_4610;
  ulong local_4608;
  ulong local_4600;
  ulong local_45f8;
  ulong local_45f0;
  ulong local_45e8;
  ulong local_45e0;
  ulong local_45d8;
  ulong local_45d0;
  ulong local_45c8;
  ulong local_45c0;
  ulong local_45b8;
  ulong local_45b0;
  ulong local_45a8;
  ulong local_45a0;
  ulong local_4598;
  ulong local_4590;
  ulong local_4588;
  ulong local_4580;
  ulong local_4578;
  ulong local_4570;
  ulong local_4568;
  ulong local_4560;
  ulong local_4558;
  ulong local_4550;
  ulong local_4548;
  ulong local_4540;
  ulong local_4538;
  ulong local_4530;
  ulong local_4528;
  ulong local_4520;
  ulong local_4518;
  ulong local_4510;
  ulong local_4508;
  ulong local_4500;
  ulong local_44f8;
  ulong local_44f0;
  ulong local_44e8;
  ulong local_44e0;
  ulong local_44d8;
  ulong local_44d0;
  ulong local_44c8;
  ulong local_44c0;
  ulong local_44b8;
  ulong local_44b0;
  ulong local_44a8;
  ulong local_44a0;
  ulong local_4498;
  ulong local_4490;
  ulong local_4488;
  ulong local_4480;
  ulong local_4478;
  ulong local_4470;
  ulong local_4468;
  ulong local_4460;
  ulong local_4458;
  ulong local_4450;
  ulong local_4448;
  ulong local_4440;
  ulong local_4438;
  ulong local_4430;
  ulong local_4428;
  ulong local_4420;
  ulong local_4418;
  ulong local_4410;
  ulong local_4408;
  ulong local_4400;
  ulong local_43f8;
  ulong local_43f0;
  ulong local_43e8;
  ulong local_43e0;
  ulong local_43d8;
  ulong local_43d0;
  ulong local_43c8;
  ulong local_43c0;
  ulong local_43b8;
  ulong local_43b0;
  ulong local_43a8;
  ulong local_43a0;
  ulong local_4398;
  ulong local_4390;
  ulong local_4388;
  ulong local_4380;
  ulong local_4378;
  ulong local_4370;
  ulong local_4368;
  ulong local_4360;
  ulong local_4358;
  ulong local_4350;
  ulong local_4348;
  ulong local_4340;
  ulong local_4338;
  ulong local_4330;
  ulong local_4328;
  ulong local_4320;
  ulong local_4318;
  ulong local_4310;
  ulong local_4308;
  ulong local_4300;
  ulong local_42f8;
  ulong local_42f0;
  ulong local_42e8;
  ulong local_42e0;
  ulong local_42d8;
  ulong local_42d0;
  ulong local_42c8;
  ulong local_42c0;
  ulong local_42b8;
  ulong local_42b0;
  ulong local_42a8;
  ulong local_42a0;
  ulong local_4298;
  ulong local_4290;
  ulong local_4288;
  ulong local_4280;
  ulong local_4278;
  ulong local_4270;
  ulong local_4268;
  ulong local_4260;
  ulong local_4258;
  ulong local_4250;
  ulong local_4248;
  ulong local_4240;
  ulong local_4238;
  ulong local_4230;
  ulong local_4228;
  ulong local_4220;
  ulong local_4218;
  ulong local_4210;
  ulong local_4208;
  ulong local_4200;
  ulong local_41f8;
  ulong local_41f0;
  ulong local_41e8;
  ulong local_41e0;
  ulong local_41d8;
  ulong local_41d0;
  ulong local_41c8;
  ulong local_41c0;
  ulong local_41b8;
  ulong local_41b0;
  ulong local_41a8;
  ulong local_41a0;
  ulong local_4198;
  ulong local_4190;
  ulong local_4188;
  ulong local_4180;
  ulong local_4178;
  ulong local_4170;
  ulong local_4168;
  ulong local_4160;
  ulong local_4158;
  ulong local_4150;
  ulong local_4148;
  ulong local_4140;
  ulong local_4138;
  ulong local_4130;
  ulong local_4128;
  ulong local_4120;
  ulong local_4118;
  ulong local_4110;
  ulong local_4108;
  ulong local_4100;
  ulong local_40f8;
  ulong local_40f0;
  ulong local_40e8;
  ulong local_40e0;
  ulong local_40d8;
  ulong local_40d0;
  ulong local_40c8;
  ulong local_40c0;
  ulong local_40b8;
  ulong local_40b0;
  ulong local_40a8;
  ulong local_40a0;
  ulong local_4098;
  ulong local_4090;
  ulong local_4088;
  ulong local_4080;
  ulong local_4078;
  ulong local_4070;
  ulong local_4068;
  ulong local_4060;
  ulong local_4058;
  ulong local_4050;
  ulong local_4048;
  ulong local_4040;
  ulong auStack_4038 [63];
  long local_3e40 [193];
  ulong local_3838 [1783];
  ULARGE_INTEGER__XX ctr2;
  ULARGE_INTEGER__XX mulHigh;
  ULARGE_INTEGER__XX c_ctr1;
  ULARGE_INTEGER__XX mulHigh_2;
  
  auStack_46b8[1] = 0;
  if (cnt < 0x400) {
    uVar540 = 0;
  }
  else {
    puVar528 = chars + 0x78;
    uVar503 = 0;
    uVar540 = 0;
    do {
      auVar552 = ZEXT1664((undefined1  [16])0x0);
      uVar509 = 0xfffffffffffffff0;
      auVar553 = ZEXT1664((undefined1  [16])0x0);
      auVar555 = ZEXT1664((undefined1  [16])0x0);
      auVar554 = ZEXT1664((undefined1  [16])0x0);
      auVar551 = ZEXT1664((undefined1  [16])0x0);
      auVar550 = ZEXT1664((undefined1  [16])0x0);
      lVar543 = 0;
      uVar548 = 0;
      lVar542 = 0;
      prVar3 = this->curr_rd;
      uVar501 = prVar3->const_term;
      do {
        auVar557 = *(undefined1 (*) [32])((long)prVar3->random_coeff + lVar543);
        auVar559 = *(undefined1 (*) [32])(puVar528 + lVar543 + -0x78);
        auVar4._8_8_ = 0;
        auVar4._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x58);
        auVar253._8_8_ = 0;
        auVar253._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x20);
        uVar512 = SUB168(auVar4 * auVar253,8);
        uVar546 = SUB168(auVar4 * auVar253,0);
        uVar502 = uVar501 + uVar546;
        uVar546 = (ulong)CARRY8(uVar501,uVar546);
        bVar549 = CARRY8(uVar548,uVar512);
        uVar512 = uVar548 + uVar512;
        uVar521 = uVar512 + uVar546;
        auVar5._8_8_ = 0;
        auVar5._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x50);
        auVar254._8_8_ = 0;
        auVar254._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x28);
        uVar513 = SUB168(auVar5 * auVar254,8);
        uVar501 = SUB168(auVar5 * auVar254,0);
        uVar548 = uVar502 + uVar501;
        uVar502 = (ulong)CARRY8(uVar502,uVar501);
        uVar514 = uVar521 + uVar513;
        uVar533 = uVar514 + uVar502;
        auVar6._8_8_ = 0;
        auVar6._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x48);
        auVar255._8_8_ = 0;
        auVar255._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x30);
        uVar515 = SUB168(auVar6 * auVar255,8);
        uVar501 = SUB168(auVar6 * auVar255,0);
        uVar505 = uVar548 + uVar501;
        uVar508 = (ulong)CARRY8(uVar548,uVar501);
        uVar524 = uVar533 + uVar515;
        uVar534 = uVar524 + uVar508;
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x40);
        auVar256._8_8_ = 0;
        auVar256._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x38);
        uVar516 = SUB168(auVar7 * auVar256,8);
        uVar501 = SUB168(auVar7 * auVar256,0);
        uVar548 = uVar505 + uVar501;
        uVar505 = (ulong)CARRY8(uVar505,uVar501);
        uVar525 = uVar534 + uVar516;
        uVar535 = uVar525 + uVar505;
        uVar509 = uVar509 + 0x10;
        auVar560 = vpmuludq_avx2(auVar559,auVar557);
        auVar496 = vpaddq_avx2(auVar560,auVar552._0_32_);
        auVar560 = vpsrlq_avx2(auVar560,0x20);
        auVar560 = vpaddq_avx2(auVar560,auVar553._0_32_);
        auVar561 = vpsrlq_avx2(auVar557,0x20);
        auVar558 = vpmuludq_avx2(auVar561,auVar559);
        auVar559 = vpsrlq_avx2(auVar559,0x20);
        auVar556 = vpmuludq_avx2(auVar559,auVar557);
        auVar559 = vpmuludq_avx2(auVar561,auVar559);
        auVar557 = *(undefined1 (*) [32])(puVar528 + lVar543 + -0x38);
        auVar561 = vpaddq_avx2(auVar558,auVar555._0_32_);
        auVar562 = vpsrlq_avx2(auVar558,0x20);
        auVar558 = vpaddq_avx2(auVar559,auVar551._0_32_);
        auVar559 = vpsrlq_avx2(auVar559,0x20);
        auVar562 = vpaddq_avx2(auVar562,auVar554._0_32_);
        auVar563 = vpsrlq_avx2(auVar556,0x20);
        auVar497 = vpaddq_avx2(auVar559,auVar550._0_32_);
        auVar559 = *(undefined1 (*) [32])((long)prVar3->random_coeff + lVar543 + 0x40);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x18);
        auVar257._8_8_ = 0;
        auVar257._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x60);
        uVar517 = SUB168(auVar8 * auVar257,8);
        uVar501 = SUB168(auVar8 * auVar257,0);
        uVar506 = uVar548 + uVar501;
        uVar510 = (ulong)CARRY8(uVar548,uVar501);
        uVar526 = uVar535 + uVar517;
        uVar536 = uVar526 + uVar510;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = *(ulong *)(puVar528 + lVar543 + -0x10);
        auVar258._8_8_ = 0;
        auVar258._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x68);
        uVar518 = SUB168(auVar9 * auVar258,8);
        uVar501 = SUB168(auVar9 * auVar258,0);
        uVar548 = uVar506 + uVar501;
        uVar506 = (ulong)CARRY8(uVar506,uVar501);
        uVar527 = uVar536 + uVar518;
        uVar537 = uVar527 + uVar506;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = *(ulong *)(puVar528 + lVar543 + -8);
        auVar259._8_8_ = 0;
        auVar259._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x70);
        uVar519 = SUB168(auVar10 * auVar259,8);
        uVar501 = SUB168(auVar10 * auVar259,0);
        uVar507 = uVar548 + uVar501;
        uVar511 = (ulong)CARRY8(uVar548,uVar501);
        uVar522 = uVar537 + uVar519;
        uVar538 = uVar522 + uVar511;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = *(ulong *)(puVar528 + lVar543);
        auVar260._8_8_ = 0;
        auVar260._0_8_ = *(ulong *)((long)prVar3->random_coeff + lVar543 + 0x78);
        uVar520 = SUB168(auVar11 * auVar260,8);
        uVar548 = SUB168(auVar11 * auVar260,0);
        uVar501 = uVar507 + uVar548;
        uVar507 = (ulong)CARRY8(uVar507,uVar548);
        uVar523 = uVar538 + uVar520;
        uVar548 = uVar523 + uVar507;
        lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar512,uVar546)) +
                  (ulong)(CARRY8(uVar521,uVar513) || CARRY8(uVar514,uVar502)) +
                  (ulong)(CARRY8(uVar533,uVar515) || CARRY8(uVar524,uVar508)) +
                  (ulong)(CARRY8(uVar534,uVar516) || CARRY8(uVar525,uVar505)) +
                  (ulong)(CARRY8(uVar535,uVar517) || CARRY8(uVar526,uVar510)) +
                  (ulong)(CARRY8(uVar536,uVar518) || CARRY8(uVar527,uVar506)) +
                  (ulong)(CARRY8(uVar537,uVar519) || CARRY8(uVar522,uVar511)) +
                  (ulong)(CARRY8(uVar538,uVar520) || CARRY8(uVar523,uVar507));
        lVar543 = lVar543 + 0x80;
        auVar565 = vpsrlq_avx2(auVar559,0x20);
        auVar564 = vpmuludq_avx2(auVar557,auVar559);
        auVar498 = vpmuludq_avx2(auVar557,auVar565);
        auVar496 = vpaddq_avx2(auVar564,auVar496);
        auVar552 = ZEXT3264(auVar496);
        auVar564 = vpsrlq_avx2(auVar564,0x20);
        auVar556 = vpaddq_avx2(auVar498,auVar556);
        auVar560 = vpaddq_avx2(auVar564,auVar560);
        auVar553 = ZEXT3264(auVar560);
        auVar561 = vpaddq_avx2(auVar561,auVar556);
        auVar556 = vpsrlq_avx2(auVar498,0x20);
        auVar556 = vpaddq_avx2(auVar563,auVar556);
        auVar562 = vpaddq_avx2(auVar562,auVar556);
        auVar557 = vpsrlq_avx2(auVar557,0x20);
        auVar559 = vpmuludq_avx2(auVar557,auVar559);
        auVar556 = vpmuludq_avx2(auVar565,auVar557);
        auVar557 = vpaddq_avx2(auVar561,auVar559);
        auVar555 = ZEXT3264(auVar557);
        auVar561 = vpsrlq_avx2(auVar559,0x20);
        auVar559 = vpaddq_avx2(auVar558,auVar556);
        auVar551 = ZEXT3264(auVar559);
        auVar558 = vpsrlq_avx2(auVar556,0x20);
        auVar561 = vpaddq_avx2(auVar562,auVar561);
        auVar554 = ZEXT3264(auVar561);
        auVar558 = vpaddq_avx2(auVar497,auVar558);
        auVar550 = ZEXT3264(auVar558);
      } while (uVar509 < 0x70);
      auVar4 = vpaddq_avx(auVar496._0_16_,auVar496._16_16_);
      auVar5 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpaddq_avx(auVar4,auVar5);
      auVar5 = vpaddq_avx(auVar560._0_16_,auVar560._16_16_);
      auVar6 = vpshufd_avx(auVar5,0xee);
      auVar5 = vpaddq_avx(auVar5,auVar6);
      auVar6 = vpaddq_avx(auVar557._0_16_,auVar557._16_16_);
      auVar7 = vpshufd_avx(auVar6,0xee);
      auVar6 = vpaddq_avx(auVar6,auVar7);
      auVar7 = vpaddq_avx(auVar561._0_16_,auVar561._16_16_);
      uVar509 = (ulong)(uint)(auVar4._4_4_ - auVar5._0_4_) + auVar5._0_8_ +
                (auVar6._0_8_ & 0xffffffff);
      auVar5 = vpshufd_avx(auVar7,0xee);
      auVar5 = vpaddq_avx(auVar7,auVar5);
      uVar502 = uVar509 << 0x20 | auVar4._0_8_ & 0xffffffff;
      auVar4 = vpaddq_avx(auVar559._0_16_,auVar559._16_16_);
      auVar7 = vpshufd_avx(auVar4,0xee);
      auVar4 = vpaddq_avx(auVar4,auVar7);
      auVar7 = vpaddq_avx(auVar558._0_16_,auVar558._16_16_);
      auVar8 = vpshufd_avx(auVar7,0xee);
      auVar7 = vpaddq_avx(auVar7,auVar8);
      uVar509 = (auVar4._0_8_ & 0xffffffff) + auVar5._0_8_ +
                (ulong)(uint)(auVar6._4_4_ - auVar5._0_4_) + (uVar509 >> 0x20);
      uVar546 = (uVar509 >> 0x20) + (ulong)(uint)(auVar4._4_4_ - auVar7._0_4_) + auVar7._0_8_;
      uVar508 = uVar502 + uVar501;
      uVar501 = (uVar546 << 0x20 | uVar509 & 0xffffffff) + (ulong)CARRY8(uVar502,uVar501);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = uVar501 + uVar548;
      uVar509 = SUB168(auVar12 * ZEXT816(0xd),0);
      uVar501 = ((uVar546 >> 0x20) + lVar542 + (ulong)CARRY8(uVar501,uVar548)) * 0xa9 + 0xd +
                SUB168(auVar12 * ZEXT816(0xd),8) * 0xd;
      uVar548 = uVar501 + uVar508;
      uVar546 = uVar548 - uVar509;
      uVar501 = (((ulong)CARRY8(uVar501,uVar508) + 1) - (ulong)(uVar548 < uVar509)) * -0xd + uVar546
      ;
      if ((uVar546 < 0x1a) && (0x19 < uVar501)) {
        bVar549 = 0xfffffffffffffff2 < uVar501;
        uVar501 = uVar501 + 0xd;
        uVar548 = (ulong)bVar549;
      }
      else {
        uVar548 = 0;
      }
      lVar542 = auStack_46b8[1] + 1;
      local_3838[auStack_46b8[1] * 2] = uVar501;
      local_3838[auStack_46b8[1] * 2 + 1] = uVar548;
      auStack_46b8[1] = lVar542;
      if (lVar542 == 0x80) {
        lVar542 = 1;
        iVar545 = 0x80;
        lVar543 = 0x538;
        puVar529 = auStack_46b8 + 1;
        do {
          *puVar529 = 0;
          uVar501 = 0xffffffffffffffe0;
          plVar530 = local_3e40 + (long)iVar545 * 2;
          prVar3 = this->curr_rd;
          local_4708 = prVar3[lVar542].const_term;
          local_4710 = 0;
          local_4718 = 0;
          do {
            if (plVar530[-0x3e] == 0) {
              local_4048 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x18);
              auVar13._8_8_ = 0;
              auVar13._0_8_ = plVar530[-0x3f];
              auVar261._8_8_ = 0;
              auVar261._0_8_ = local_4048;
              uVar546 = SUB168(auVar13 * auVar261,8);
              uVar509 = SUB168(auVar13 * auVar261,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4040 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x18);
              auVar45._8_8_ = 0;
              auVar45._0_8_ = plVar530[-0x3f];
              auVar293._8_8_ = 0;
              auVar293._0_8_ = local_4040;
              uVar509 = SUB168(auVar45 * auVar293,0);
              uVar546 = plVar530[-0x3e] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x18) +
                        SUB168(auVar45 * auVar293,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x3c] == 0) {
              local_4058 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x10);
              auVar14._8_8_ = 0;
              auVar14._0_8_ = plVar530[-0x3d];
              auVar262._8_8_ = 0;
              auVar262._0_8_ = local_4058;
              uVar546 = SUB168(auVar14 * auVar262,8);
              uVar509 = SUB168(auVar14 * auVar262,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4050 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x10);
              auVar46._8_8_ = 0;
              auVar46._0_8_ = plVar530[-0x3d];
              auVar294._8_8_ = 0;
              auVar294._0_8_ = local_4050;
              uVar509 = SUB168(auVar46 * auVar294,0);
              uVar546 = plVar530[-0x3c] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -0x10) +
                        SUB168(auVar46 * auVar294,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x3a] == 0) {
              local_4068 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -8);
              auVar15._8_8_ = 0;
              auVar15._0_8_ = plVar530[-0x3b];
              auVar263._8_8_ = 0;
              auVar263._0_8_ = local_4068;
              uVar546 = SUB168(auVar15 * auVar263,8);
              uVar509 = SUB168(auVar15 * auVar263,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4060 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -8);
              auVar47._8_8_ = 0;
              auVar47._0_8_ = plVar530[-0x3b];
              auVar295._8_8_ = 0;
              auVar295._0_8_ = local_4060;
              uVar509 = SUB168(auVar47 * auVar295,0);
              uVar546 = plVar530[-0x3a] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + -8) +
                        SUB168(auVar47 * auVar295,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x38] == 0) {
              local_4078 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543);
              auVar16._8_8_ = 0;
              auVar16._0_8_ = plVar530[-0x39];
              auVar264._8_8_ = 0;
              auVar264._0_8_ = local_4078;
              uVar546 = SUB168(auVar16 * auVar264,8);
              uVar509 = SUB168(auVar16 * auVar264,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4070 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543);
              auVar48._8_8_ = 0;
              auVar48._0_8_ = plVar530[-0x39];
              auVar296._8_8_ = 0;
              auVar296._0_8_ = local_4070;
              uVar509 = SUB168(auVar48 * auVar296,0);
              uVar546 = plVar530[-0x38] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543) +
                        SUB168(auVar48 * auVar296,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x36] == 0) {
              local_4088 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 8);
              auVar17._8_8_ = 0;
              auVar17._0_8_ = plVar530[-0x37];
              auVar265._8_8_ = 0;
              auVar265._0_8_ = local_4088;
              uVar546 = SUB168(auVar17 * auVar265,8);
              uVar509 = SUB168(auVar17 * auVar265,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4080 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 8);
              auVar49._8_8_ = 0;
              auVar49._0_8_ = plVar530[-0x37];
              auVar297._8_8_ = 0;
              auVar297._0_8_ = local_4080;
              uVar509 = SUB168(auVar49 * auVar297,0);
              uVar546 = plVar530[-0x36] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 8) +
                        SUB168(auVar49 * auVar297,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x34] == 0) {
              local_4098 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x10);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = plVar530[-0x35];
              auVar266._8_8_ = 0;
              auVar266._0_8_ = local_4098;
              uVar546 = SUB168(auVar18 * auVar266,8);
              uVar509 = SUB168(auVar18 * auVar266,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4090 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x10);
              auVar50._8_8_ = 0;
              auVar50._0_8_ = plVar530[-0x35];
              auVar298._8_8_ = 0;
              auVar298._0_8_ = local_4090;
              uVar509 = SUB168(auVar50 * auVar298,0);
              uVar546 = plVar530[-0x34] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x10) +
                        SUB168(auVar50 * auVar298,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x32] == 0) {
              local_40a8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x18);
              auVar19._8_8_ = 0;
              auVar19._0_8_ = plVar530[-0x33];
              auVar267._8_8_ = 0;
              auVar267._0_8_ = local_40a8;
              uVar546 = SUB168(auVar19 * auVar267,8);
              uVar509 = SUB168(auVar19 * auVar267,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40a0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x18);
              auVar51._8_8_ = 0;
              auVar51._0_8_ = plVar530[-0x33];
              auVar299._8_8_ = 0;
              auVar299._0_8_ = local_40a0;
              uVar509 = SUB168(auVar51 * auVar299,0);
              uVar546 = plVar530[-0x32] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x18) +
                        SUB168(auVar51 * auVar299,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x30] == 0) {
              local_40b8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x20);
              auVar20._8_8_ = 0;
              auVar20._0_8_ = plVar530[-0x31];
              auVar268._8_8_ = 0;
              auVar268._0_8_ = local_40b8;
              uVar546 = SUB168(auVar20 * auVar268,8);
              uVar509 = SUB168(auVar20 * auVar268,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40b0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x20);
              auVar52._8_8_ = 0;
              auVar52._0_8_ = plVar530[-0x31];
              auVar300._8_8_ = 0;
              auVar300._0_8_ = local_40b0;
              uVar509 = SUB168(auVar52 * auVar300,0);
              uVar546 = plVar530[-0x30] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x20) +
                        SUB168(auVar52 * auVar300,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2e] == 0) {
              local_40c8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x28);
              auVar21._8_8_ = 0;
              auVar21._0_8_ = plVar530[-0x2f];
              auVar269._8_8_ = 0;
              auVar269._0_8_ = local_40c8;
              uVar546 = SUB168(auVar21 * auVar269,8);
              uVar509 = SUB168(auVar21 * auVar269,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40c0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x28);
              auVar53._8_8_ = 0;
              auVar53._0_8_ = plVar530[-0x2f];
              auVar301._8_8_ = 0;
              auVar301._0_8_ = local_40c0;
              uVar509 = SUB168(auVar53 * auVar301,0);
              uVar546 = plVar530[-0x2e] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x28) +
                        SUB168(auVar53 * auVar301,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2c] == 0) {
              local_40d8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x30);
              auVar22._8_8_ = 0;
              auVar22._0_8_ = plVar530[-0x2d];
              auVar270._8_8_ = 0;
              auVar270._0_8_ = local_40d8;
              uVar546 = SUB168(auVar22 * auVar270,8);
              uVar509 = SUB168(auVar22 * auVar270,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40d0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x30);
              auVar54._8_8_ = 0;
              auVar54._0_8_ = plVar530[-0x2d];
              auVar302._8_8_ = 0;
              auVar302._0_8_ = local_40d0;
              uVar509 = SUB168(auVar54 * auVar302,0);
              uVar546 = plVar530[-0x2c] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x30) +
                        SUB168(auVar54 * auVar302,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2a] == 0) {
              local_40e8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x38);
              auVar23._8_8_ = 0;
              auVar23._0_8_ = plVar530[-0x2b];
              auVar271._8_8_ = 0;
              auVar271._0_8_ = local_40e8;
              uVar546 = SUB168(auVar23 * auVar271,8);
              uVar509 = SUB168(auVar23 * auVar271,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40e0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x38);
              auVar55._8_8_ = 0;
              auVar55._0_8_ = plVar530[-0x2b];
              auVar303._8_8_ = 0;
              auVar303._0_8_ = local_40e0;
              uVar509 = SUB168(auVar55 * auVar303,0);
              uVar546 = plVar530[-0x2a] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x38) +
                        SUB168(auVar55 * auVar303,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x28] == 0) {
              local_40f8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x40);
              auVar24._8_8_ = 0;
              auVar24._0_8_ = plVar530[-0x29];
              auVar272._8_8_ = 0;
              auVar272._0_8_ = local_40f8;
              uVar546 = SUB168(auVar24 * auVar272,8);
              uVar509 = SUB168(auVar24 * auVar272,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_40f0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x40);
              auVar56._8_8_ = 0;
              auVar56._0_8_ = plVar530[-0x29];
              auVar304._8_8_ = 0;
              auVar304._0_8_ = local_40f0;
              uVar509 = SUB168(auVar56 * auVar304,0);
              uVar546 = plVar530[-0x28] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x40) +
                        SUB168(auVar56 * auVar304,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x26] == 0) {
              local_4108 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x48);
              auVar25._8_8_ = 0;
              auVar25._0_8_ = plVar530[-0x27];
              auVar273._8_8_ = 0;
              auVar273._0_8_ = local_4108;
              uVar546 = SUB168(auVar25 * auVar273,8);
              uVar509 = SUB168(auVar25 * auVar273,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4100 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x48);
              auVar57._8_8_ = 0;
              auVar57._0_8_ = plVar530[-0x27];
              auVar305._8_8_ = 0;
              auVar305._0_8_ = local_4100;
              uVar509 = SUB168(auVar57 * auVar305,0);
              uVar546 = plVar530[-0x26] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x48) +
                        SUB168(auVar57 * auVar305,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x24] == 0) {
              local_4118 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x50);
              auVar26._8_8_ = 0;
              auVar26._0_8_ = plVar530[-0x25];
              auVar274._8_8_ = 0;
              auVar274._0_8_ = local_4118;
              uVar546 = SUB168(auVar26 * auVar274,8);
              uVar509 = SUB168(auVar26 * auVar274,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4110 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x50);
              auVar58._8_8_ = 0;
              auVar58._0_8_ = plVar530[-0x25];
              auVar306._8_8_ = 0;
              auVar306._0_8_ = local_4110;
              uVar509 = SUB168(auVar58 * auVar306,0);
              uVar546 = plVar530[-0x24] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x50) +
                        SUB168(auVar58 * auVar306,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x22] == 0) {
              local_4128 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x58);
              auVar27._8_8_ = 0;
              auVar27._0_8_ = plVar530[-0x23];
              auVar275._8_8_ = 0;
              auVar275._0_8_ = local_4128;
              uVar546 = SUB168(auVar27 * auVar275,8);
              uVar509 = SUB168(auVar27 * auVar275,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4120 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x58);
              auVar59._8_8_ = 0;
              auVar59._0_8_ = plVar530[-0x23];
              auVar307._8_8_ = 0;
              auVar307._0_8_ = local_4120;
              uVar509 = SUB168(auVar59 * auVar307,0);
              uVar546 = plVar530[-0x22] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x58) +
                        SUB168(auVar59 * auVar307,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x20] == 0) {
              local_4138 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x60);
              auVar28._8_8_ = 0;
              auVar28._0_8_ = plVar530[-0x21];
              auVar276._8_8_ = 0;
              auVar276._0_8_ = local_4138;
              uVar546 = SUB168(auVar28 * auVar276,8);
              uVar509 = SUB168(auVar28 * auVar276,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4130 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x60);
              auVar60._8_8_ = 0;
              auVar60._0_8_ = plVar530[-0x21];
              auVar308._8_8_ = 0;
              auVar308._0_8_ = local_4130;
              uVar509 = SUB168(auVar60 * auVar308,0);
              uVar546 = plVar530[-0x20] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x60) +
                        SUB168(auVar60 * auVar308,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1e] == 0) {
              local_4148 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x68);
              auVar29._8_8_ = 0;
              auVar29._0_8_ = plVar530[-0x1f];
              auVar277._8_8_ = 0;
              auVar277._0_8_ = local_4148;
              uVar546 = SUB168(auVar29 * auVar277,8);
              uVar509 = SUB168(auVar29 * auVar277,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4140 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x68);
              auVar61._8_8_ = 0;
              auVar61._0_8_ = plVar530[-0x1f];
              auVar309._8_8_ = 0;
              auVar309._0_8_ = local_4140;
              uVar509 = SUB168(auVar61 * auVar309,0);
              uVar546 = plVar530[-0x1e] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x68) +
                        SUB168(auVar61 * auVar309,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1c] == 0) {
              local_4158 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x70);
              auVar30._8_8_ = 0;
              auVar30._0_8_ = plVar530[-0x1d];
              auVar278._8_8_ = 0;
              auVar278._0_8_ = local_4158;
              uVar546 = SUB168(auVar30 * auVar278,8);
              uVar509 = SUB168(auVar30 * auVar278,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4150 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x70);
              auVar62._8_8_ = 0;
              auVar62._0_8_ = plVar530[-0x1d];
              auVar310._8_8_ = 0;
              auVar310._0_8_ = local_4150;
              uVar509 = SUB168(auVar62 * auVar310,0);
              uVar546 = plVar530[-0x1c] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x70) +
                        SUB168(auVar62 * auVar310,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1a] == 0) {
              local_4168 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x78);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = plVar530[-0x1b];
              auVar279._8_8_ = 0;
              auVar279._0_8_ = local_4168;
              uVar546 = SUB168(auVar31 * auVar279,8);
              uVar509 = SUB168(auVar31 * auVar279,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4160 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x78);
              auVar63._8_8_ = 0;
              auVar63._0_8_ = plVar530[-0x1b];
              auVar311._8_8_ = 0;
              auVar311._0_8_ = local_4160;
              uVar509 = SUB168(auVar63 * auVar311,0);
              uVar546 = plVar530[-0x1a] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x78) +
                        SUB168(auVar63 * auVar311,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x18] == 0) {
              local_4178 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x80);
              auVar32._8_8_ = 0;
              auVar32._0_8_ = plVar530[-0x19];
              auVar280._8_8_ = 0;
              auVar280._0_8_ = local_4178;
              uVar546 = SUB168(auVar32 * auVar280,8);
              uVar509 = SUB168(auVar32 * auVar280,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4170 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x80);
              auVar64._8_8_ = 0;
              auVar64._0_8_ = plVar530[-0x19];
              auVar312._8_8_ = 0;
              auVar312._0_8_ = local_4170;
              uVar509 = SUB168(auVar64 * auVar312,0);
              uVar546 = plVar530[-0x18] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x80) +
                        SUB168(auVar64 * auVar312,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x16] == 0) {
              local_4188 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x88);
              auVar33._8_8_ = 0;
              auVar33._0_8_ = plVar530[-0x17];
              auVar281._8_8_ = 0;
              auVar281._0_8_ = local_4188;
              uVar546 = SUB168(auVar33 * auVar281,8);
              uVar509 = SUB168(auVar33 * auVar281,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4180 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x88);
              auVar65._8_8_ = 0;
              auVar65._0_8_ = plVar530[-0x17];
              auVar313._8_8_ = 0;
              auVar313._0_8_ = local_4180;
              uVar509 = SUB168(auVar65 * auVar313,0);
              uVar546 = plVar530[-0x16] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x88) +
                        SUB168(auVar65 * auVar313,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x14] == 0) {
              local_4198 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x90);
              auVar34._8_8_ = 0;
              auVar34._0_8_ = plVar530[-0x15];
              auVar282._8_8_ = 0;
              auVar282._0_8_ = local_4198;
              uVar546 = SUB168(auVar34 * auVar282,8);
              uVar509 = SUB168(auVar34 * auVar282,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4190 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x90);
              auVar66._8_8_ = 0;
              auVar66._0_8_ = plVar530[-0x15];
              auVar314._8_8_ = 0;
              auVar314._0_8_ = local_4190;
              uVar509 = SUB168(auVar66 * auVar314,0);
              uVar546 = plVar530[-0x14] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x90) +
                        SUB168(auVar66 * auVar314,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x12] == 0) {
              local_41a8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x98);
              auVar35._8_8_ = 0;
              auVar35._0_8_ = plVar530[-0x13];
              auVar283._8_8_ = 0;
              auVar283._0_8_ = local_41a8;
              uVar546 = SUB168(auVar35 * auVar283,8);
              uVar509 = SUB168(auVar35 * auVar283,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41a0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x98);
              auVar67._8_8_ = 0;
              auVar67._0_8_ = plVar530[-0x13];
              auVar315._8_8_ = 0;
              auVar315._0_8_ = local_41a0;
              uVar509 = SUB168(auVar67 * auVar315,0);
              uVar546 = plVar530[-0x12] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0x98) +
                        SUB168(auVar67 * auVar315,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x10] == 0) {
              local_41b8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa0);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = plVar530[-0x11];
              auVar284._8_8_ = 0;
              auVar284._0_8_ = local_41b8;
              uVar546 = SUB168(auVar36 * auVar284,8);
              uVar509 = SUB168(auVar36 * auVar284,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41b0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa0);
              auVar68._8_8_ = 0;
              auVar68._0_8_ = plVar530[-0x11];
              auVar316._8_8_ = 0;
              auVar316._0_8_ = local_41b0;
              uVar509 = SUB168(auVar68 * auVar316,0);
              uVar546 = plVar530[-0x10] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa0) +
                        SUB168(auVar68 * auVar316,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0xe] == 0) {
              local_41c8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa8);
              auVar37._8_8_ = 0;
              auVar37._0_8_ = plVar530[-0xf];
              auVar285._8_8_ = 0;
              auVar285._0_8_ = local_41c8;
              uVar546 = SUB168(auVar37 * auVar285,8);
              uVar509 = SUB168(auVar37 * auVar285,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41c0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa8);
              auVar69._8_8_ = 0;
              auVar69._0_8_ = plVar530[-0xf];
              auVar317._8_8_ = 0;
              auVar317._0_8_ = local_41c0;
              uVar509 = SUB168(auVar69 * auVar317,0);
              uVar546 = plVar530[-0xe] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xa8) +
                        SUB168(auVar69 * auVar317,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0xc] == 0) {
              local_41d8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb0);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = plVar530[-0xd];
              auVar286._8_8_ = 0;
              auVar286._0_8_ = local_41d8;
              uVar546 = SUB168(auVar38 * auVar286,8);
              uVar509 = SUB168(auVar38 * auVar286,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41d0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb0);
              auVar70._8_8_ = 0;
              auVar70._0_8_ = plVar530[-0xd];
              auVar318._8_8_ = 0;
              auVar318._0_8_ = local_41d0;
              uVar509 = SUB168(auVar70 * auVar318,0);
              uVar546 = plVar530[-0xc] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb0) +
                        SUB168(auVar70 * auVar318,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-10] == 0) {
              local_41e8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb8);
              auVar39._8_8_ = 0;
              auVar39._0_8_ = plVar530[-0xb];
              auVar287._8_8_ = 0;
              auVar287._0_8_ = local_41e8;
              uVar546 = SUB168(auVar39 * auVar287,8);
              uVar509 = SUB168(auVar39 * auVar287,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41e0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb8);
              auVar71._8_8_ = 0;
              auVar71._0_8_ = plVar530[-0xb];
              auVar319._8_8_ = 0;
              auVar319._0_8_ = local_41e0;
              uVar509 = SUB168(auVar71 * auVar319,0);
              uVar546 = plVar530[-10] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xb8) +
                        SUB168(auVar71 * auVar319,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-8] == 0) {
              local_41f8 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xc0);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = plVar530[-9];
              auVar288._8_8_ = 0;
              auVar288._0_8_ = local_41f8;
              uVar546 = SUB168(auVar40 * auVar288,8);
              uVar509 = SUB168(auVar40 * auVar288,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_41f0 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xc0);
              auVar72._8_8_ = 0;
              auVar72._0_8_ = plVar530[-9];
              auVar320._8_8_ = 0;
              auVar320._0_8_ = local_41f0;
              uVar509 = SUB168(auVar72 * auVar320,0);
              uVar546 = plVar530[-8] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xc0) +
                        SUB168(auVar72 * auVar320,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-6] == 0) {
              local_4208 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 200);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = plVar530[-7];
              auVar289._8_8_ = 0;
              auVar289._0_8_ = local_4208;
              uVar546 = SUB168(auVar41 * auVar289,8);
              uVar509 = SUB168(auVar41 * auVar289,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4200 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 200);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = plVar530[-7];
              auVar321._8_8_ = 0;
              auVar321._0_8_ = local_4200;
              uVar509 = SUB168(auVar73 * auVar321,0);
              uVar546 = plVar530[-6] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 200) +
                        SUB168(auVar73 * auVar321,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-4] == 0) {
              local_4218 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd0);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = plVar530[-5];
              auVar290._8_8_ = 0;
              auVar290._0_8_ = local_4218;
              uVar546 = SUB168(auVar42 * auVar290,8);
              uVar509 = SUB168(auVar42 * auVar290,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4210 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd0);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = plVar530[-5];
              auVar322._8_8_ = 0;
              auVar322._0_8_ = local_4210;
              uVar509 = SUB168(auVar74 * auVar322,0);
              uVar546 = plVar530[-4] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd0) +
                        SUB168(auVar74 * auVar322,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-2] == 0) {
              local_4228 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd8);
              auVar43._8_8_ = 0;
              auVar43._0_8_ = plVar530[-3];
              auVar291._8_8_ = 0;
              auVar291._0_8_ = local_4228;
              uVar546 = SUB168(auVar43 * auVar291,8);
              uVar509 = SUB168(auVar43 * auVar291,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4220 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd8);
              auVar75._8_8_ = 0;
              auVar75._0_8_ = plVar530[-3];
              auVar323._8_8_ = 0;
              auVar323._0_8_ = local_4220;
              uVar509 = SUB168(auVar75 * auVar323,0);
              uVar546 = plVar530[-2] *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xd8) +
                        SUB168(auVar75 * auVar323,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            if (*plVar530 == 0) {
              local_4238 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xe0);
              auVar44._8_8_ = 0;
              auVar44._0_8_ = plVar530[-1];
              auVar292._8_8_ = 0;
              auVar292._0_8_ = local_4238;
              uVar546 = SUB168(auVar44 * auVar292,8);
              uVar509 = SUB168(auVar44 * auVar292,0);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            else {
              local_4230 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xe0);
              auVar76._8_8_ = 0;
              auVar76._0_8_ = plVar530[-1];
              auVar324._8_8_ = 0;
              auVar324._0_8_ = local_4230;
              uVar509 = SUB168(auVar76 * auVar324,0);
              uVar546 = *plVar530 *
                        *(long *)((long)prVar3->random_coeff + uVar501 * 8 + lVar543 + 0xe0) +
                        SUB168(auVar76 * auVar324,8);
              uVar548 = local_4710 + uVar546;
              bVar549 = CARRY8(local_4710,uVar546) ||
                        CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
              local_4710 = uVar548 + CARRY8(local_4708,uVar509);
            }
            local_4708 = local_4708 + uVar509;
            local_4718 = local_4718 + (ulong)bVar549;
            uVar501 = uVar501 + 0x20;
            plVar530 = plVar530 + 0x40;
          } while (uVar501 < 0x60);
          auVar77._8_8_ = 0;
          auVar77._0_8_ = local_4710;
          uVar548 = SUB168(auVar77 * ZEXT816(0xd),0);
          uVar501 = local_4718 * 0xa9 + 0xd + SUB168(auVar77 * ZEXT816(0xd),8) * 0xd;
          uVar509 = uVar501 + local_4708;
          uVar546 = uVar509 - uVar548;
          uVar501 = (((ulong)CARRY8(uVar501,local_4708) + 1) - (ulong)(uVar509 < uVar548)) * -0xd +
                    uVar546;
          if ((uVar546 < 0x1a) && (0x19 < uVar501)) {
            bVar549 = 0xfffffffffffffff2 < uVar501;
            uVar501 = uVar501 + 0xd;
            uVar548 = (ulong)bVar549;
          }
          else {
            uVar548 = 0;
          }
          uVar531 = 1 << ((uint)lVar542 & 0x1f);
          if ((uVar540 & uVar531) == 0) {
            uVar540 = uVar540 | uVar531;
            puVar529[1] = 0;
          }
          puVar529 = auStack_46b8 + lVar542 + 1;
          lVar542 = lVar542 + 1;
          iVar545 = iVar545 + 0x80;
          lVar543 = lVar543 + 0x420;
          uVar509 = *puVar529;
          lVar532 = (long)((int)lVar542 << 7);
          *puVar529 = uVar509 + 1;
          auStack_4038[uVar509 * 2 + lVar532 * 2] = uVar501;
          auStack_4038[uVar509 * 2 + lVar532 * 2 + 1] = uVar548;
        } while (uVar509 + 1 == 0x80);
      }
      puVar528 = puVar528 + 0x400;
      uVar503 = uVar503 + 1;
    } while (uVar503 != cnt >> 10);
  }
  prVar3 = this->curr_rd;
  uVar531 = (uint)cnt;
  uVar501 = (ulong)(uVar531 & 0x3ff);
  uVar548 = cnt & 0xfffffffffffffc00;
  uVar541 = (uVar531 & 0x3ff) >> 3;
  uVar503 = prVar3->const_term;
  if (uVar501 < 0x40) {
    lVar542 = 0;
    uVar509 = 0;
  }
  else {
    uVar546 = 0;
    uVar509 = 0;
    lVar542 = 0;
    do {
      auVar78._8_8_ = 0;
      auVar78._0_8_ = *(ulong *)(chars + uVar546 + uVar548);
      auVar325._8_8_ = 0;
      auVar325._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546);
      uVar514 = SUB168(auVar78 * auVar325,8);
      uVar502 = SUB168(auVar78 * auVar325,0);
      uVar508 = uVar503 + uVar502;
      uVar502 = (ulong)CARRY8(uVar503,uVar502);
      bVar549 = CARRY8(uVar509,uVar514);
      uVar514 = uVar509 + uVar514;
      uVar533 = uVar514 + uVar502;
      auVar79._8_8_ = 0;
      auVar79._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 8);
      auVar326._8_8_ = 0;
      auVar326._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 8);
      uVar515 = SUB168(auVar79 * auVar326,8);
      uVar503 = SUB168(auVar79 * auVar326,0);
      uVar509 = uVar508 + uVar503;
      uVar508 = (ulong)CARRY8(uVar508,uVar503);
      uVar524 = uVar533 + uVar515;
      uVar534 = uVar524 + uVar508;
      auVar80._8_8_ = 0;
      auVar80._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x10);
      auVar327._8_8_ = 0;
      auVar327._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x10);
      uVar516 = SUB168(auVar80 * auVar327,8);
      uVar503 = SUB168(auVar80 * auVar327,0);
      uVar510 = uVar509 + uVar503;
      uVar505 = (ulong)CARRY8(uVar509,uVar503);
      uVar525 = uVar534 + uVar516;
      uVar535 = uVar525 + uVar505;
      auVar81._8_8_ = 0;
      auVar81._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x18);
      auVar328._8_8_ = 0;
      auVar328._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x18);
      uVar517 = SUB168(auVar81 * auVar328,8);
      uVar503 = SUB168(auVar81 * auVar328,0);
      uVar509 = uVar510 + uVar503;
      uVar510 = (ulong)CARRY8(uVar510,uVar503);
      uVar526 = uVar535 + uVar517;
      uVar536 = uVar526 + uVar510;
      auVar82._8_8_ = 0;
      auVar82._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x20);
      auVar329._8_8_ = 0;
      auVar329._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x20);
      uVar518 = SUB168(auVar82 * auVar329,8);
      uVar503 = SUB168(auVar82 * auVar329,0);
      uVar511 = uVar509 + uVar503;
      uVar506 = (ulong)CARRY8(uVar509,uVar503);
      uVar527 = uVar536 + uVar518;
      uVar537 = uVar527 + uVar506;
      auVar83._8_8_ = 0;
      auVar83._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x28);
      auVar330._8_8_ = 0;
      auVar330._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x28);
      uVar519 = SUB168(auVar83 * auVar330,8);
      uVar503 = SUB168(auVar83 * auVar330,0);
      uVar509 = uVar511 + uVar503;
      uVar511 = (ulong)CARRY8(uVar511,uVar503);
      uVar522 = uVar537 + uVar519;
      uVar538 = uVar522 + uVar511;
      auVar84._8_8_ = 0;
      auVar84._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x30);
      auVar331._8_8_ = 0;
      auVar331._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x30);
      uVar520 = SUB168(auVar84 * auVar331,8);
      uVar503 = SUB168(auVar84 * auVar331,0);
      uVar512 = uVar509 + uVar503;
      uVar507 = (ulong)CARRY8(uVar509,uVar503);
      uVar523 = uVar538 + uVar520;
      uVar539 = uVar523 + uVar507;
      auVar85._8_8_ = 0;
      auVar85._0_8_ = *(ulong *)(chars + uVar546 + uVar548 + 0x38);
      auVar332._8_8_ = 0;
      auVar332._0_8_ = *(ulong *)((long)prVar3->random_coeff + uVar546 + 0x38);
      uVar521 = SUB168(auVar85 * auVar332,8);
      uVar509 = SUB168(auVar85 * auVar332,0);
      uVar503 = uVar512 + uVar509;
      uVar512 = (ulong)CARRY8(uVar512,uVar509);
      uVar513 = uVar539 + uVar521;
      uVar509 = uVar513 + uVar512;
      lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar514,uVar502)) +
                (ulong)(CARRY8(uVar533,uVar515) || CARRY8(uVar524,uVar508)) +
                (ulong)(CARRY8(uVar534,uVar516) || CARRY8(uVar525,uVar505)) +
                (ulong)(CARRY8(uVar535,uVar517) || CARRY8(uVar526,uVar510)) +
                (ulong)(CARRY8(uVar536,uVar518) || CARRY8(uVar527,uVar506)) +
                (ulong)(CARRY8(uVar537,uVar519) || CARRY8(uVar522,uVar511)) +
                (ulong)(CARRY8(uVar538,uVar520) || CARRY8(uVar523,uVar507)) +
                (ulong)(CARRY8(uVar539,uVar521) || CARRY8(uVar513,uVar512));
      uVar546 = uVar546 + 0x40;
    } while ((uVar531 & 0x3c0) != uVar546);
  }
  uVar547 = uVar541 & 0xfffffff8;
  switch(uVar541 & 7) {
  case 0:
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
switchD_00187601_caseD_2:
      uVar546 = (ulong)*(ushort *)(chars + uVar501 + (uVar548 - 2)) | 0x10000;
      goto switchD_00187601_caseD_0;
    case 3:
switchD_00187601_caseD_3:
      uVar546 = (ulong)chars[uVar501 + (uVar548 - 1)] * 0x10000 + 0x1000000 +
                (ulong)*(ushort *)(chars + uVar501 + (uVar548 - 3));
      goto switchD_00187601_caseD_0;
    case 4:
switchD_00187601_caseD_4:
      uVar546 = (ulong)*(uint *)(chars + uVar501 + (uVar548 - 4)) | 0x100000000;
      goto switchD_00187601_caseD_0;
    case 5:
switchD_00187601_caseD_5:
      uVar546 = (ulong)CONCAT14(chars[uVar501 + (uVar548 - 1)],
                                *(undefined4 *)(chars + uVar501 + (uVar548 - 5))) | 0x10000000000;
      goto switchD_00187601_caseD_0;
    case 6:
switchD_00187601_caseD_6:
      uVar546 = (ulong)CONCAT24(*(undefined2 *)(chars + uVar501 + (uVar548 - 2)),
                                *(undefined4 *)(chars + uVar501 + (uVar548 - 6))) | 0x1000000000000;
      goto switchD_00187601_caseD_0;
    case 7:
switchD_00187601_caseD_7:
      uVar546 = (ulong)CONCAT16(chars[uVar501 + (uVar548 - 1)],
                                CONCAT24(*(undefined2 *)(chars + uVar501 + (uVar548 - 3)),
                                         *(undefined4 *)(chars + uVar501 + (uVar548 - 7)))) |
                0x100000000000000;
      goto switchD_00187601_caseD_0;
    }
    break;
  case 1:
    auVar102._8_8_ = 0;
    auVar102._0_8_ = *(ulong *)(chars + (uVar547 << 3) + uVar548);
    auVar349._8_8_ = 0;
    auVar349._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 << 3));
    uVar502 = SUB168(auVar102 * auVar349,8);
    uVar546 = SUB168(auVar102 * auVar349,0);
    bVar549 = CARRY8(uVar503,uVar546);
    uVar503 = uVar503 + uVar546;
    uVar546 = (ulong)bVar549;
    bVar549 = CARRY8(uVar509,uVar502);
    uVar502 = uVar509 + uVar502;
    uVar509 = uVar502 + uVar546;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar502,uVar546));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 2:
    uVar547 = uVar547 << 3;
    auVar90._8_8_ = 0;
    auVar90._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar337._8_8_ = 0;
    auVar337._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar508 = SUB168(auVar90 * auVar337,8);
    uVar546 = SUB168(auVar90 * auVar337,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar508);
    uVar508 = uVar509 + uVar508;
    uVar506 = uVar508 + uVar546;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar338._8_8_ = 0;
    auVar338._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar510 = SUB168(auVar91 * auVar338,8);
    uVar509 = SUB168(auVar91 * auVar338,0);
    uVar503 = uVar502 + uVar509;
    uVar502 = (ulong)CARRY8(uVar502,uVar509);
    uVar505 = uVar506 + uVar510;
    uVar509 = uVar505 + uVar502;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar508,uVar546)) +
              (ulong)(CARRY8(uVar506,uVar510) || CARRY8(uVar505,uVar502));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 3:
    uVar547 = uVar547 << 3;
    auVar92._8_8_ = 0;
    auVar92._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar339._8_8_ = 0;
    auVar339._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar505 = SUB168(auVar92 * auVar339,8);
    uVar546 = SUB168(auVar92 * auVar339,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar505);
    uVar505 = uVar509 + uVar505;
    uVar512 = uVar505 + uVar546;
    auVar93._8_8_ = 0;
    auVar93._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar340._8_8_ = 0;
    auVar340._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar511 = SUB168(auVar93 * auVar340,8);
    uVar503 = SUB168(auVar93 * auVar340,0);
    uVar508 = uVar502 + uVar503;
    uVar502 = (ulong)CARRY8(uVar502,uVar503);
    uVar510 = uVar512 + uVar511;
    uVar514 = uVar510 + uVar502;
    auVar94._8_8_ = 0;
    auVar94._0_8_ = *(ulong *)(chars + (uVar547 | 0x10) + uVar548);
    auVar341._8_8_ = 0;
    auVar341._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x10));
    uVar507 = SUB168(auVar94 * auVar341,8);
    uVar509 = SUB168(auVar94 * auVar341,0);
    uVar503 = uVar508 + uVar509;
    uVar508 = (ulong)CARRY8(uVar508,uVar509);
    uVar506 = uVar514 + uVar507;
    uVar509 = uVar506 + uVar508;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar505,uVar546)) +
              (ulong)(CARRY8(uVar512,uVar511) || CARRY8(uVar510,uVar502)) +
              (ulong)(CARRY8(uVar514,uVar507) || CARRY8(uVar506,uVar508));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 4:
    uVar547 = uVar547 << 3;
    auVar86._8_8_ = 0;
    auVar86._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar333._8_8_ = 0;
    auVar333._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar510 = SUB168(auVar86 * auVar333,8);
    uVar546 = SUB168(auVar86 * auVar333,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar510);
    uVar510 = uVar509 + uVar510;
    uVar525 = uVar510 + uVar546;
    auVar87._8_8_ = 0;
    auVar87._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar334._8_8_ = 0;
    auVar334._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar512 = SUB168(auVar87 * auVar334,8);
    uVar503 = SUB168(auVar87 * auVar334,0);
    uVar509 = uVar502 + uVar503;
    uVar502 = (ulong)CARRY8(uVar502,uVar503);
    uVar506 = uVar525 + uVar512;
    uVar526 = uVar506 + uVar502;
    auVar88._8_8_ = 0;
    auVar88._0_8_ = *(ulong *)(chars + (uVar547 | 0x10) + uVar548);
    auVar335._8_8_ = 0;
    auVar335._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x10));
    uVar514 = SUB168(auVar88 * auVar335,8);
    uVar503 = SUB168(auVar88 * auVar335,0);
    uVar505 = uVar509 + uVar503;
    uVar508 = (ulong)CARRY8(uVar509,uVar503);
    uVar511 = uVar526 + uVar514;
    uVar527 = uVar511 + uVar508;
    auVar89._8_8_ = 0;
    auVar89._0_8_ = *(ulong *)(chars + (uVar547 | 0x18) + uVar548);
    auVar336._8_8_ = 0;
    auVar336._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x18));
    uVar524 = SUB168(auVar89 * auVar336,8);
    uVar509 = SUB168(auVar89 * auVar336,0);
    uVar503 = uVar505 + uVar509;
    uVar505 = (ulong)CARRY8(uVar505,uVar509);
    uVar507 = uVar527 + uVar524;
    uVar509 = uVar507 + uVar505;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar510,uVar546)) +
              (ulong)(CARRY8(uVar525,uVar512) || CARRY8(uVar506,uVar502)) +
              (ulong)(CARRY8(uVar526,uVar514) || CARRY8(uVar511,uVar508)) +
              (ulong)(CARRY8(uVar527,uVar524) || CARRY8(uVar507,uVar505));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 5:
    uVar547 = uVar547 << 3;
    auVar103._8_8_ = 0;
    auVar103._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar350._8_8_ = 0;
    auVar350._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar506 = SUB168(auVar103 * auVar350,8);
    uVar546 = SUB168(auVar103 * auVar350,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar506);
    uVar506 = uVar509 + uVar506;
    uVar522 = uVar506 + uVar546;
    auVar104._8_8_ = 0;
    auVar104._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar351._8_8_ = 0;
    auVar351._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar524 = SUB168(auVar104 * auVar351,8);
    uVar503 = SUB168(auVar104 * auVar351,0);
    uVar509 = uVar502 + uVar503;
    uVar502 = (ulong)CARRY8(uVar502,uVar503);
    uVar511 = uVar522 + uVar524;
    uVar523 = uVar511 + uVar502;
    auVar105._8_8_ = 0;
    auVar105._0_8_ = *(ulong *)(chars + (uVar547 | 0x10) + uVar548);
    auVar352._8_8_ = 0;
    auVar352._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x10));
    uVar525 = SUB168(auVar105 * auVar352,8);
    uVar503 = SUB168(auVar105 * auVar352,0);
    uVar505 = uVar509 + uVar503;
    uVar508 = (ulong)CARRY8(uVar509,uVar503);
    uVar507 = uVar523 + uVar525;
    uVar513 = uVar507 + uVar508;
    auVar106._8_8_ = 0;
    auVar106._0_8_ = *(ulong *)(chars + (uVar547 | 0x18) + uVar548);
    auVar353._8_8_ = 0;
    auVar353._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x18));
    uVar526 = SUB168(auVar106 * auVar353,8);
    uVar503 = SUB168(auVar106 * auVar353,0);
    uVar510 = uVar505 + uVar503;
    uVar505 = (ulong)CARRY8(uVar505,uVar503);
    uVar512 = uVar513 + uVar526;
    uVar515 = uVar512 + uVar505;
    auVar107._8_8_ = 0;
    auVar107._0_8_ = *(ulong *)(chars + (uVar547 | 0x20) + uVar548);
    auVar354._8_8_ = 0;
    auVar354._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x20));
    uVar527 = SUB168(auVar107 * auVar354,8);
    uVar509 = SUB168(auVar107 * auVar354,0);
    uVar503 = uVar510 + uVar509;
    uVar510 = (ulong)CARRY8(uVar510,uVar509);
    uVar514 = uVar515 + uVar527;
    uVar509 = uVar514 + uVar510;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar506,uVar546)) +
              (ulong)(CARRY8(uVar522,uVar524) || CARRY8(uVar511,uVar502)) +
              (ulong)(CARRY8(uVar523,uVar525) || CARRY8(uVar507,uVar508)) +
              (ulong)(CARRY8(uVar513,uVar526) || CARRY8(uVar512,uVar505)) +
              (ulong)(CARRY8(uVar515,uVar527) || CARRY8(uVar514,uVar510));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 6:
    uVar547 = uVar547 << 3;
    auVar108._8_8_ = 0;
    auVar108._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar355._8_8_ = 0;
    auVar355._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar511 = SUB168(auVar108 * auVar355,8);
    uVar546 = SUB168(auVar108 * auVar355,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar511);
    uVar511 = uVar509 + uVar511;
    uVar515 = uVar511 + uVar546;
    auVar109._8_8_ = 0;
    auVar109._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar356._8_8_ = 0;
    auVar356._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar526 = SUB168(auVar109 * auVar356,8);
    uVar503 = SUB168(auVar109 * auVar356,0);
    uVar509 = uVar502 + uVar503;
    uVar502 = (ulong)CARRY8(uVar502,uVar503);
    uVar507 = uVar515 + uVar526;
    uVar516 = uVar507 + uVar502;
    auVar110._8_8_ = 0;
    auVar110._0_8_ = *(ulong *)(chars + (uVar547 | 0x10) + uVar548);
    auVar357._8_8_ = 0;
    auVar357._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x10));
    uVar527 = SUB168(auVar110 * auVar357,8);
    uVar503 = SUB168(auVar110 * auVar357,0);
    uVar505 = uVar509 + uVar503;
    uVar508 = (ulong)CARRY8(uVar509,uVar503);
    uVar512 = uVar516 + uVar527;
    uVar517 = uVar512 + uVar508;
    auVar111._8_8_ = 0;
    auVar111._0_8_ = *(ulong *)(chars + (uVar547 | 0x18) + uVar548);
    auVar358._8_8_ = 0;
    auVar358._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x18));
    uVar522 = SUB168(auVar111 * auVar358,8);
    uVar503 = SUB168(auVar111 * auVar358,0);
    uVar509 = uVar505 + uVar503;
    uVar505 = (ulong)CARRY8(uVar505,uVar503);
    uVar514 = uVar517 + uVar522;
    uVar518 = uVar514 + uVar505;
    auVar112._8_8_ = 0;
    auVar112._0_8_ = *(ulong *)(chars + (uVar547 | 0x20) + uVar548);
    auVar359._8_8_ = 0;
    auVar359._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x20));
    uVar523 = SUB168(auVar112 * auVar359,8);
    uVar503 = SUB168(auVar112 * auVar359,0);
    uVar506 = uVar509 + uVar503;
    uVar510 = (ulong)CARRY8(uVar509,uVar503);
    uVar524 = uVar518 + uVar523;
    uVar519 = uVar524 + uVar510;
    auVar113._8_8_ = 0;
    auVar113._0_8_ = *(ulong *)(chars + (uVar547 | 0x28) + uVar548);
    auVar360._8_8_ = 0;
    auVar360._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x28));
    uVar513 = SUB168(auVar113 * auVar360,8);
    uVar509 = SUB168(auVar113 * auVar360,0);
    uVar503 = uVar506 + uVar509;
    uVar506 = (ulong)CARRY8(uVar506,uVar509);
    uVar525 = uVar519 + uVar513;
    uVar509 = uVar525 + uVar506;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar511,uVar546)) +
              (ulong)(CARRY8(uVar515,uVar526) || CARRY8(uVar507,uVar502)) +
              (ulong)(CARRY8(uVar516,uVar527) || CARRY8(uVar512,uVar508)) +
              (ulong)(CARRY8(uVar517,uVar522) || CARRY8(uVar514,uVar505)) +
              (ulong)(CARRY8(uVar518,uVar523) || CARRY8(uVar524,uVar510)) +
              (ulong)(CARRY8(uVar519,uVar513) || CARRY8(uVar525,uVar506));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
    break;
  case 7:
    uVar547 = uVar547 << 3;
    auVar95._8_8_ = 0;
    auVar95._0_8_ = *(ulong *)(chars + uVar547 + uVar548);
    auVar342._8_8_ = 0;
    auVar342._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)uVar547);
    uVar507 = SUB168(auVar95 * auVar342,8);
    uVar546 = SUB168(auVar95 * auVar342,0);
    uVar502 = uVar503 + uVar546;
    uVar546 = (ulong)CARRY8(uVar503,uVar546);
    bVar549 = CARRY8(uVar509,uVar507);
    uVar507 = uVar509 + uVar507;
    uVar518 = uVar507 + uVar546;
    auVar96._8_8_ = 0;
    auVar96._0_8_ = *(ulong *)(chars + (uVar547 | 8) + uVar548);
    auVar343._8_8_ = 0;
    auVar343._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 8));
    uVar522 = SUB168(auVar96 * auVar343,8);
    uVar503 = SUB168(auVar96 * auVar343,0);
    uVar509 = uVar502 + uVar503;
    uVar502 = (ulong)CARRY8(uVar502,uVar503);
    uVar512 = uVar518 + uVar522;
    uVar519 = uVar512 + uVar502;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = *(ulong *)(chars + (uVar547 | 0x10) + uVar548);
    auVar344._8_8_ = 0;
    auVar344._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x10));
    uVar523 = SUB168(auVar97 * auVar344,8);
    uVar503 = SUB168(auVar97 * auVar344,0);
    uVar505 = uVar509 + uVar503;
    uVar508 = (ulong)CARRY8(uVar509,uVar503);
    uVar514 = uVar519 + uVar523;
    uVar520 = uVar514 + uVar508;
    auVar98._8_8_ = 0;
    auVar98._0_8_ = *(ulong *)(chars + (uVar547 | 0x18) + uVar548);
    auVar345._8_8_ = 0;
    auVar345._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x18));
    uVar513 = SUB168(auVar98 * auVar345,8);
    uVar503 = SUB168(auVar98 * auVar345,0);
    uVar509 = uVar505 + uVar503;
    uVar505 = (ulong)CARRY8(uVar505,uVar503);
    uVar524 = uVar520 + uVar513;
    uVar521 = uVar524 + uVar505;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = *(ulong *)(chars + (uVar547 | 0x20) + uVar548);
    auVar346._8_8_ = 0;
    auVar346._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x20));
    uVar515 = SUB168(auVar99 * auVar346,8);
    uVar503 = SUB168(auVar99 * auVar346,0);
    uVar506 = uVar509 + uVar503;
    uVar510 = (ulong)CARRY8(uVar509,uVar503);
    uVar525 = uVar521 + uVar515;
    uVar533 = uVar525 + uVar510;
    auVar100._8_8_ = 0;
    auVar100._0_8_ = *(ulong *)(chars + (uVar547 | 0x28) + uVar548);
    auVar347._8_8_ = 0;
    auVar347._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x28));
    uVar516 = SUB168(auVar100 * auVar347,8);
    uVar503 = SUB168(auVar100 * auVar347,0);
    uVar511 = uVar506 + uVar503;
    uVar506 = (ulong)CARRY8(uVar506,uVar503);
    uVar526 = uVar533 + uVar516;
    uVar534 = uVar526 + uVar506;
    auVar101._8_8_ = 0;
    auVar101._0_8_ = *(ulong *)(chars + (uVar547 | 0x30) + uVar548);
    auVar348._8_8_ = 0;
    auVar348._0_8_ = *(ulong *)((long)prVar3->random_coeff + (ulong)(uVar547 | 0x30));
    uVar517 = SUB168(auVar101 * auVar348,8);
    uVar509 = SUB168(auVar101 * auVar348,0);
    uVar503 = uVar511 + uVar509;
    uVar511 = (ulong)CARRY8(uVar511,uVar509);
    uVar527 = uVar534 + uVar517;
    uVar509 = uVar527 + uVar511;
    lVar542 = lVar542 + (ulong)(bVar549 || CARRY8(uVar507,uVar546)) +
              (ulong)(CARRY8(uVar518,uVar522) || CARRY8(uVar512,uVar502)) +
              (ulong)(CARRY8(uVar519,uVar523) || CARRY8(uVar514,uVar508)) +
              (ulong)(CARRY8(uVar520,uVar513) || CARRY8(uVar524,uVar505)) +
              (ulong)(CARRY8(uVar521,uVar515) || CARRY8(uVar525,uVar510)) +
              (ulong)(CARRY8(uVar533,uVar516) || CARRY8(uVar526,uVar506)) +
              (ulong)(CARRY8(uVar534,uVar517) || CARRY8(uVar527,uVar511));
    uVar546 = 1;
    switch(uVar531 & 7) {
    case 0:
      goto switchD_00187601_caseD_0;
    case 2:
      goto switchD_00187601_caseD_2;
    case 3:
      goto switchD_00187601_caseD_3;
    case 4:
      goto switchD_00187601_caseD_4;
    case 5:
      goto switchD_00187601_caseD_5;
    case 6:
      goto switchD_00187601_caseD_6;
    case 7:
      goto switchD_00187601_caseD_7;
    }
  }
  uVar546 = (ulong)chars[uVar501 + (uVar548 - 1)] | 0x100;
switchD_00187601_caseD_0:
  puVar529 = auStack_46b8 + 1;
  auVar114._8_8_ = 0;
  auVar114._0_8_ = uVar546;
  auVar361._8_8_ = 0;
  auVar361._0_8_ = prVar3->random_coeff[uVar541];
  uVar502 = SUB168(auVar114 * auVar361,8);
  uVar501 = SUB168(auVar114 * auVar361,0);
  uVar546 = uVar503 + uVar501;
  uVar503 = (ulong)CARRY8(uVar503,uVar501);
  uVar501 = uVar509 + uVar502;
  auVar115._8_8_ = 0;
  auVar115._0_8_ = uVar501 + uVar503;
  uVar548 = SUB168(auVar115 * ZEXT816(0xd),0);
  uVar503 = (lVar542 + (ulong)(CARRY8(uVar509,uVar502) || CARRY8(uVar501,uVar503))) * 0xa9 + 0xd +
            SUB168(auVar115 * ZEXT816(0xd),8) * 0xd;
  uVar501 = 0;
  uVar509 = uVar503 + uVar546;
  uVar502 = uVar509 - uVar548;
  uVar503 = (((ulong)CARRY8(uVar503,uVar546) + 1) - (ulong)(uVar509 < uVar548)) * -0xd + uVar502;
  if ((uVar502 < 0x1a) && (uVar501 = 0, 0x19 < uVar503)) {
    bVar549 = 0xfffffffffffffff2 < uVar503;
    uVar503 = uVar503 + 0xd;
    uVar501 = (ulong)bVar549;
  }
  lVar542 = auStack_46b8[1] + 1;
  local_3838[auStack_46b8[1] * 2] = uVar503;
  local_3838[auStack_46b8[1] * 2 + 1] = uVar501;
  auStack_46b8[1] = lVar542;
  if (lVar542 == 0x80) {
    lVar542 = 1;
    iVar545 = 0x80;
    lVar543 = 0x538;
    do {
      *puVar529 = 0;
      uVar503 = 0xffffffffffffffe0;
      plVar530 = local_3e40 + (long)iVar545 * 2;
      prVar3 = this->curr_rd;
      local_4708 = prVar3[lVar542].const_term;
      local_4710 = 0;
      local_4718 = 0;
      do {
        if (plVar530[-0x3e] == 0) {
          local_4248 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x18);
          auVar116._8_8_ = 0;
          auVar116._0_8_ = plVar530[-0x3f];
          auVar362._8_8_ = 0;
          auVar362._0_8_ = local_4248;
          uVar509 = SUB168(auVar116 * auVar362,8);
          uVar548 = SUB168(auVar116 * auVar362,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4240 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x18);
          auVar148._8_8_ = 0;
          auVar148._0_8_ = plVar530[-0x3f];
          auVar394._8_8_ = 0;
          auVar394._0_8_ = local_4240;
          uVar548 = SUB168(auVar148 * auVar394,0);
          uVar509 = plVar530[-0x3e] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x18) +
                    SUB168(auVar148 * auVar394,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x3c] == 0) {
          local_4258 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x10);
          auVar117._8_8_ = 0;
          auVar117._0_8_ = plVar530[-0x3d];
          auVar363._8_8_ = 0;
          auVar363._0_8_ = local_4258;
          uVar509 = SUB168(auVar117 * auVar363,8);
          uVar548 = SUB168(auVar117 * auVar363,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4250 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x10);
          auVar149._8_8_ = 0;
          auVar149._0_8_ = plVar530[-0x3d];
          auVar395._8_8_ = 0;
          auVar395._0_8_ = local_4250;
          uVar548 = SUB168(auVar149 * auVar395,0);
          uVar509 = plVar530[-0x3c] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -0x10) +
                    SUB168(auVar149 * auVar395,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x3a] == 0) {
          local_4268 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -8);
          auVar118._8_8_ = 0;
          auVar118._0_8_ = plVar530[-0x3b];
          auVar364._8_8_ = 0;
          auVar364._0_8_ = local_4268;
          uVar509 = SUB168(auVar118 * auVar364,8);
          uVar548 = SUB168(auVar118 * auVar364,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4260 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -8);
          auVar150._8_8_ = 0;
          auVar150._0_8_ = plVar530[-0x3b];
          auVar396._8_8_ = 0;
          auVar396._0_8_ = local_4260;
          uVar548 = SUB168(auVar150 * auVar396,0);
          uVar509 = plVar530[-0x3a] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + -8) +
                    SUB168(auVar150 * auVar396,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x38] == 0) {
          local_4278 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543);
          auVar119._8_8_ = 0;
          auVar119._0_8_ = plVar530[-0x39];
          auVar365._8_8_ = 0;
          auVar365._0_8_ = local_4278;
          uVar509 = SUB168(auVar119 * auVar365,8);
          uVar548 = SUB168(auVar119 * auVar365,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4270 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543);
          auVar151._8_8_ = 0;
          auVar151._0_8_ = plVar530[-0x39];
          auVar397._8_8_ = 0;
          auVar397._0_8_ = local_4270;
          uVar548 = SUB168(auVar151 * auVar397,0);
          uVar509 = plVar530[-0x38] * *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543)
                    + SUB168(auVar151 * auVar397,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x36] == 0) {
          local_4288 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 8);
          auVar120._8_8_ = 0;
          auVar120._0_8_ = plVar530[-0x37];
          auVar366._8_8_ = 0;
          auVar366._0_8_ = local_4288;
          uVar509 = SUB168(auVar120 * auVar366,8);
          uVar548 = SUB168(auVar120 * auVar366,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4280 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 8);
          auVar152._8_8_ = 0;
          auVar152._0_8_ = plVar530[-0x37];
          auVar398._8_8_ = 0;
          auVar398._0_8_ = local_4280;
          uVar548 = SUB168(auVar152 * auVar398,0);
          uVar509 = plVar530[-0x36] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 8) +
                    SUB168(auVar152 * auVar398,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x34] == 0) {
          local_4298 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x10);
          auVar121._8_8_ = 0;
          auVar121._0_8_ = plVar530[-0x35];
          auVar367._8_8_ = 0;
          auVar367._0_8_ = local_4298;
          uVar509 = SUB168(auVar121 * auVar367,8);
          uVar548 = SUB168(auVar121 * auVar367,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4290 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x10);
          auVar153._8_8_ = 0;
          auVar153._0_8_ = plVar530[-0x35];
          auVar399._8_8_ = 0;
          auVar399._0_8_ = local_4290;
          uVar548 = SUB168(auVar153 * auVar399,0);
          uVar509 = plVar530[-0x34] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x10) +
                    SUB168(auVar153 * auVar399,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x32] == 0) {
          local_42a8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x18);
          auVar122._8_8_ = 0;
          auVar122._0_8_ = plVar530[-0x33];
          auVar368._8_8_ = 0;
          auVar368._0_8_ = local_42a8;
          uVar509 = SUB168(auVar122 * auVar368,8);
          uVar548 = SUB168(auVar122 * auVar368,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42a0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x18);
          auVar154._8_8_ = 0;
          auVar154._0_8_ = plVar530[-0x33];
          auVar400._8_8_ = 0;
          auVar400._0_8_ = local_42a0;
          uVar548 = SUB168(auVar154 * auVar400,0);
          uVar509 = plVar530[-0x32] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x18) +
                    SUB168(auVar154 * auVar400,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x30] == 0) {
          local_42b8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x20);
          auVar123._8_8_ = 0;
          auVar123._0_8_ = plVar530[-0x31];
          auVar369._8_8_ = 0;
          auVar369._0_8_ = local_42b8;
          uVar509 = SUB168(auVar123 * auVar369,8);
          uVar548 = SUB168(auVar123 * auVar369,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42b0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x20);
          auVar155._8_8_ = 0;
          auVar155._0_8_ = plVar530[-0x31];
          auVar401._8_8_ = 0;
          auVar401._0_8_ = local_42b0;
          uVar548 = SUB168(auVar155 * auVar401,0);
          uVar509 = plVar530[-0x30] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x20) +
                    SUB168(auVar155 * auVar401,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x2e] == 0) {
          local_42c8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x28);
          auVar124._8_8_ = 0;
          auVar124._0_8_ = plVar530[-0x2f];
          auVar370._8_8_ = 0;
          auVar370._0_8_ = local_42c8;
          uVar509 = SUB168(auVar124 * auVar370,8);
          uVar548 = SUB168(auVar124 * auVar370,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42c0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x28);
          auVar156._8_8_ = 0;
          auVar156._0_8_ = plVar530[-0x2f];
          auVar402._8_8_ = 0;
          auVar402._0_8_ = local_42c0;
          uVar548 = SUB168(auVar156 * auVar402,0);
          uVar509 = plVar530[-0x2e] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x28) +
                    SUB168(auVar156 * auVar402,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x2c] == 0) {
          local_42d8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x30);
          auVar125._8_8_ = 0;
          auVar125._0_8_ = plVar530[-0x2d];
          auVar371._8_8_ = 0;
          auVar371._0_8_ = local_42d8;
          uVar509 = SUB168(auVar125 * auVar371,8);
          uVar548 = SUB168(auVar125 * auVar371,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42d0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x30);
          auVar157._8_8_ = 0;
          auVar157._0_8_ = plVar530[-0x2d];
          auVar403._8_8_ = 0;
          auVar403._0_8_ = local_42d0;
          uVar548 = SUB168(auVar157 * auVar403,0);
          uVar509 = plVar530[-0x2c] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x30) +
                    SUB168(auVar157 * auVar403,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x2a] == 0) {
          local_42e8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x38);
          auVar126._8_8_ = 0;
          auVar126._0_8_ = plVar530[-0x2b];
          auVar372._8_8_ = 0;
          auVar372._0_8_ = local_42e8;
          uVar509 = SUB168(auVar126 * auVar372,8);
          uVar548 = SUB168(auVar126 * auVar372,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42e0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x38);
          auVar158._8_8_ = 0;
          auVar158._0_8_ = plVar530[-0x2b];
          auVar404._8_8_ = 0;
          auVar404._0_8_ = local_42e0;
          uVar548 = SUB168(auVar158 * auVar404,0);
          uVar509 = plVar530[-0x2a] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x38) +
                    SUB168(auVar158 * auVar404,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x28] == 0) {
          local_42f8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x40);
          auVar127._8_8_ = 0;
          auVar127._0_8_ = plVar530[-0x29];
          auVar373._8_8_ = 0;
          auVar373._0_8_ = local_42f8;
          uVar509 = SUB168(auVar127 * auVar373,8);
          uVar548 = SUB168(auVar127 * auVar373,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_42f0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x40);
          auVar159._8_8_ = 0;
          auVar159._0_8_ = plVar530[-0x29];
          auVar405._8_8_ = 0;
          auVar405._0_8_ = local_42f0;
          uVar548 = SUB168(auVar159 * auVar405,0);
          uVar509 = plVar530[-0x28] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x40) +
                    SUB168(auVar159 * auVar405,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x26] == 0) {
          local_4308 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x48);
          auVar128._8_8_ = 0;
          auVar128._0_8_ = plVar530[-0x27];
          auVar374._8_8_ = 0;
          auVar374._0_8_ = local_4308;
          uVar509 = SUB168(auVar128 * auVar374,8);
          uVar548 = SUB168(auVar128 * auVar374,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4300 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x48);
          auVar160._8_8_ = 0;
          auVar160._0_8_ = plVar530[-0x27];
          auVar406._8_8_ = 0;
          auVar406._0_8_ = local_4300;
          uVar548 = SUB168(auVar160 * auVar406,0);
          uVar509 = plVar530[-0x26] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x48) +
                    SUB168(auVar160 * auVar406,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x24] == 0) {
          local_4318 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x50);
          auVar129._8_8_ = 0;
          auVar129._0_8_ = plVar530[-0x25];
          auVar375._8_8_ = 0;
          auVar375._0_8_ = local_4318;
          uVar509 = SUB168(auVar129 * auVar375,8);
          uVar548 = SUB168(auVar129 * auVar375,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4310 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x50);
          auVar161._8_8_ = 0;
          auVar161._0_8_ = plVar530[-0x25];
          auVar407._8_8_ = 0;
          auVar407._0_8_ = local_4310;
          uVar548 = SUB168(auVar161 * auVar407,0);
          uVar509 = plVar530[-0x24] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x50) +
                    SUB168(auVar161 * auVar407,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x22] == 0) {
          local_4328 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x58);
          auVar130._8_8_ = 0;
          auVar130._0_8_ = plVar530[-0x23];
          auVar376._8_8_ = 0;
          auVar376._0_8_ = local_4328;
          uVar509 = SUB168(auVar130 * auVar376,8);
          uVar548 = SUB168(auVar130 * auVar376,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4320 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x58);
          auVar162._8_8_ = 0;
          auVar162._0_8_ = plVar530[-0x23];
          auVar408._8_8_ = 0;
          auVar408._0_8_ = local_4320;
          uVar548 = SUB168(auVar162 * auVar408,0);
          uVar509 = plVar530[-0x22] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x58) +
                    SUB168(auVar162 * auVar408,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x20] == 0) {
          local_4338 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x60);
          auVar131._8_8_ = 0;
          auVar131._0_8_ = plVar530[-0x21];
          auVar377._8_8_ = 0;
          auVar377._0_8_ = local_4338;
          uVar509 = SUB168(auVar131 * auVar377,8);
          uVar548 = SUB168(auVar131 * auVar377,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4330 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x60);
          auVar163._8_8_ = 0;
          auVar163._0_8_ = plVar530[-0x21];
          auVar409._8_8_ = 0;
          auVar409._0_8_ = local_4330;
          uVar548 = SUB168(auVar163 * auVar409,0);
          uVar509 = plVar530[-0x20] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x60) +
                    SUB168(auVar163 * auVar409,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x1e] == 0) {
          local_4348 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x68);
          auVar132._8_8_ = 0;
          auVar132._0_8_ = plVar530[-0x1f];
          auVar378._8_8_ = 0;
          auVar378._0_8_ = local_4348;
          uVar509 = SUB168(auVar132 * auVar378,8);
          uVar548 = SUB168(auVar132 * auVar378,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4340 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x68);
          auVar164._8_8_ = 0;
          auVar164._0_8_ = plVar530[-0x1f];
          auVar410._8_8_ = 0;
          auVar410._0_8_ = local_4340;
          uVar548 = SUB168(auVar164 * auVar410,0);
          uVar509 = plVar530[-0x1e] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x68) +
                    SUB168(auVar164 * auVar410,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x1c] == 0) {
          local_4358 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x70);
          auVar133._8_8_ = 0;
          auVar133._0_8_ = plVar530[-0x1d];
          auVar379._8_8_ = 0;
          auVar379._0_8_ = local_4358;
          uVar509 = SUB168(auVar133 * auVar379,8);
          uVar548 = SUB168(auVar133 * auVar379,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4350 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x70);
          auVar165._8_8_ = 0;
          auVar165._0_8_ = plVar530[-0x1d];
          auVar411._8_8_ = 0;
          auVar411._0_8_ = local_4350;
          uVar548 = SUB168(auVar165 * auVar411,0);
          uVar509 = plVar530[-0x1c] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x70) +
                    SUB168(auVar165 * auVar411,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x1a] == 0) {
          local_4368 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x78);
          auVar134._8_8_ = 0;
          auVar134._0_8_ = plVar530[-0x1b];
          auVar380._8_8_ = 0;
          auVar380._0_8_ = local_4368;
          uVar509 = SUB168(auVar134 * auVar380,8);
          uVar548 = SUB168(auVar134 * auVar380,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4360 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x78);
          auVar166._8_8_ = 0;
          auVar166._0_8_ = plVar530[-0x1b];
          auVar412._8_8_ = 0;
          auVar412._0_8_ = local_4360;
          uVar548 = SUB168(auVar166 * auVar412,0);
          uVar509 = plVar530[-0x1a] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x78) +
                    SUB168(auVar166 * auVar412,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x18] == 0) {
          local_4378 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x80);
          auVar135._8_8_ = 0;
          auVar135._0_8_ = plVar530[-0x19];
          auVar381._8_8_ = 0;
          auVar381._0_8_ = local_4378;
          uVar509 = SUB168(auVar135 * auVar381,8);
          uVar548 = SUB168(auVar135 * auVar381,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4370 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x80);
          auVar167._8_8_ = 0;
          auVar167._0_8_ = plVar530[-0x19];
          auVar413._8_8_ = 0;
          auVar413._0_8_ = local_4370;
          uVar548 = SUB168(auVar167 * auVar413,0);
          uVar509 = plVar530[-0x18] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x80) +
                    SUB168(auVar167 * auVar413,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x16] == 0) {
          local_4388 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x88);
          auVar136._8_8_ = 0;
          auVar136._0_8_ = plVar530[-0x17];
          auVar382._8_8_ = 0;
          auVar382._0_8_ = local_4388;
          uVar509 = SUB168(auVar136 * auVar382,8);
          uVar548 = SUB168(auVar136 * auVar382,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4380 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x88);
          auVar168._8_8_ = 0;
          auVar168._0_8_ = plVar530[-0x17];
          auVar414._8_8_ = 0;
          auVar414._0_8_ = local_4380;
          uVar548 = SUB168(auVar168 * auVar414,0);
          uVar509 = plVar530[-0x16] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x88) +
                    SUB168(auVar168 * auVar414,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x14] == 0) {
          local_4398 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x90);
          auVar137._8_8_ = 0;
          auVar137._0_8_ = plVar530[-0x15];
          auVar383._8_8_ = 0;
          auVar383._0_8_ = local_4398;
          uVar509 = SUB168(auVar137 * auVar383,8);
          uVar548 = SUB168(auVar137 * auVar383,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4390 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x90);
          auVar169._8_8_ = 0;
          auVar169._0_8_ = plVar530[-0x15];
          auVar415._8_8_ = 0;
          auVar415._0_8_ = local_4390;
          uVar548 = SUB168(auVar169 * auVar415,0);
          uVar509 = plVar530[-0x14] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x90) +
                    SUB168(auVar169 * auVar415,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x12] == 0) {
          local_43a8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x98);
          auVar138._8_8_ = 0;
          auVar138._0_8_ = plVar530[-0x13];
          auVar384._8_8_ = 0;
          auVar384._0_8_ = local_43a8;
          uVar509 = SUB168(auVar138 * auVar384,8);
          uVar548 = SUB168(auVar138 * auVar384,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43a0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x98);
          auVar170._8_8_ = 0;
          auVar170._0_8_ = plVar530[-0x13];
          auVar416._8_8_ = 0;
          auVar416._0_8_ = local_43a0;
          uVar548 = SUB168(auVar170 * auVar416,0);
          uVar509 = plVar530[-0x12] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0x98) +
                    SUB168(auVar170 * auVar416,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0x10] == 0) {
          local_43b8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa0);
          auVar139._8_8_ = 0;
          auVar139._0_8_ = plVar530[-0x11];
          auVar385._8_8_ = 0;
          auVar385._0_8_ = local_43b8;
          uVar509 = SUB168(auVar139 * auVar385,8);
          uVar548 = SUB168(auVar139 * auVar385,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43b0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa0);
          auVar171._8_8_ = 0;
          auVar171._0_8_ = plVar530[-0x11];
          auVar417._8_8_ = 0;
          auVar417._0_8_ = local_43b0;
          uVar548 = SUB168(auVar171 * auVar417,0);
          uVar509 = plVar530[-0x10] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa0) +
                    SUB168(auVar171 * auVar417,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0xe] == 0) {
          local_43c8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa8);
          auVar140._8_8_ = 0;
          auVar140._0_8_ = plVar530[-0xf];
          auVar386._8_8_ = 0;
          auVar386._0_8_ = local_43c8;
          uVar509 = SUB168(auVar140 * auVar386,8);
          uVar548 = SUB168(auVar140 * auVar386,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43c0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa8);
          auVar172._8_8_ = 0;
          auVar172._0_8_ = plVar530[-0xf];
          auVar418._8_8_ = 0;
          auVar418._0_8_ = local_43c0;
          uVar548 = SUB168(auVar172 * auVar418,0);
          uVar509 = plVar530[-0xe] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xa8) +
                    SUB168(auVar172 * auVar418,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-0xc] == 0) {
          local_43d8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb0);
          auVar141._8_8_ = 0;
          auVar141._0_8_ = plVar530[-0xd];
          auVar387._8_8_ = 0;
          auVar387._0_8_ = local_43d8;
          uVar509 = SUB168(auVar141 * auVar387,8);
          uVar548 = SUB168(auVar141 * auVar387,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43d0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb0);
          auVar173._8_8_ = 0;
          auVar173._0_8_ = plVar530[-0xd];
          auVar419._8_8_ = 0;
          auVar419._0_8_ = local_43d0;
          uVar548 = SUB168(auVar173 * auVar419,0);
          uVar509 = plVar530[-0xc] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb0) +
                    SUB168(auVar173 * auVar419,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-10] == 0) {
          local_43e8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb8);
          auVar142._8_8_ = 0;
          auVar142._0_8_ = plVar530[-0xb];
          auVar388._8_8_ = 0;
          auVar388._0_8_ = local_43e8;
          uVar509 = SUB168(auVar142 * auVar388,8);
          uVar548 = SUB168(auVar142 * auVar388,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43e0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb8);
          auVar174._8_8_ = 0;
          auVar174._0_8_ = plVar530[-0xb];
          auVar420._8_8_ = 0;
          auVar420._0_8_ = local_43e0;
          uVar548 = SUB168(auVar174 * auVar420,0);
          uVar509 = plVar530[-10] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xb8) +
                    SUB168(auVar174 * auVar420,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-8] == 0) {
          local_43f8 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xc0);
          auVar143._8_8_ = 0;
          auVar143._0_8_ = plVar530[-9];
          auVar389._8_8_ = 0;
          auVar389._0_8_ = local_43f8;
          uVar509 = SUB168(auVar143 * auVar389,8);
          uVar548 = SUB168(auVar143 * auVar389,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_43f0 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xc0);
          auVar175._8_8_ = 0;
          auVar175._0_8_ = plVar530[-9];
          auVar421._8_8_ = 0;
          auVar421._0_8_ = local_43f0;
          uVar548 = SUB168(auVar175 * auVar421,0);
          uVar509 = plVar530[-8] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xc0) +
                    SUB168(auVar175 * auVar421,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-6] == 0) {
          local_4408 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 200);
          auVar144._8_8_ = 0;
          auVar144._0_8_ = plVar530[-7];
          auVar390._8_8_ = 0;
          auVar390._0_8_ = local_4408;
          uVar509 = SUB168(auVar144 * auVar390,8);
          uVar548 = SUB168(auVar144 * auVar390,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4400 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 200);
          auVar176._8_8_ = 0;
          auVar176._0_8_ = plVar530[-7];
          auVar422._8_8_ = 0;
          auVar422._0_8_ = local_4400;
          uVar548 = SUB168(auVar176 * auVar422,0);
          uVar509 = plVar530[-6] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 200) +
                    SUB168(auVar176 * auVar422,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-4] == 0) {
          local_4418 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd0);
          auVar145._8_8_ = 0;
          auVar145._0_8_ = plVar530[-5];
          auVar391._8_8_ = 0;
          auVar391._0_8_ = local_4418;
          uVar509 = SUB168(auVar145 * auVar391,8);
          uVar548 = SUB168(auVar145 * auVar391,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4410 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd0);
          auVar177._8_8_ = 0;
          auVar177._0_8_ = plVar530[-5];
          auVar423._8_8_ = 0;
          auVar423._0_8_ = local_4410;
          uVar548 = SUB168(auVar177 * auVar423,0);
          uVar509 = plVar530[-4] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd0) +
                    SUB168(auVar177 * auVar423,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (plVar530[-2] == 0) {
          local_4428 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd8);
          auVar146._8_8_ = 0;
          auVar146._0_8_ = plVar530[-3];
          auVar392._8_8_ = 0;
          auVar392._0_8_ = local_4428;
          uVar509 = SUB168(auVar146 * auVar392,8);
          uVar548 = SUB168(auVar146 * auVar392,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4420 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd8);
          auVar178._8_8_ = 0;
          auVar178._0_8_ = plVar530[-3];
          auVar424._8_8_ = 0;
          auVar424._0_8_ = local_4420;
          uVar548 = SUB168(auVar178 * auVar424,0);
          uVar509 = plVar530[-2] *
                    *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xd8) +
                    SUB168(auVar178 * auVar424,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        if (*plVar530 == 0) {
          local_4438 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xe0);
          auVar147._8_8_ = 0;
          auVar147._0_8_ = plVar530[-1];
          auVar393._8_8_ = 0;
          auVar393._0_8_ = local_4438;
          uVar509 = SUB168(auVar147 * auVar393,8);
          uVar548 = SUB168(auVar147 * auVar393,0);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        else {
          local_4430 = *(ulong *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xe0);
          auVar179._8_8_ = 0;
          auVar179._0_8_ = plVar530[-1];
          auVar425._8_8_ = 0;
          auVar425._0_8_ = local_4430;
          uVar548 = SUB168(auVar179 * auVar425,0);
          uVar509 = *plVar530 * *(long *)((long)prVar3->random_coeff + uVar503 * 8 + lVar543 + 0xe0)
                    + SUB168(auVar179 * auVar425,8);
          uVar501 = local_4710 + uVar509;
          bVar549 = CARRY8(local_4710,uVar509) || CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
          local_4710 = uVar501 + CARRY8(local_4708,uVar548);
        }
        local_4708 = local_4708 + uVar548;
        local_4718 = local_4718 + (ulong)bVar549;
        uVar503 = uVar503 + 0x20;
        plVar530 = plVar530 + 0x40;
      } while (uVar503 < 0x60);
      auVar180._8_8_ = 0;
      auVar180._0_8_ = local_4710;
      uVar501 = SUB168(auVar180 * ZEXT816(0xd),0);
      uVar503 = local_4718 * 0xa9 + 0xd + SUB168(auVar180 * ZEXT816(0xd),8) * 0xd;
      uVar548 = uVar503 + local_4708;
      uVar509 = uVar548 - uVar501;
      uVar503 = (((ulong)CARRY8(uVar503,local_4708) + 1) - (ulong)(uVar548 < uVar501)) * -0xd +
                uVar509;
      if ((uVar509 < 0x1a) && (0x19 < uVar503)) {
        bVar549 = 0xfffffffffffffff2 < uVar503;
        uVar503 = uVar503 + 0xd;
        uVar501 = (ulong)bVar549;
      }
      else {
        uVar501 = 0;
      }
      uVar531 = 1 << ((uint)lVar542 & 0x1f);
      if ((uVar540 & uVar531) == 0) {
        uVar540 = uVar540 | uVar531;
        puVar529[1] = 0;
      }
      puVar529 = auStack_46b8 + lVar542 + 1;
      lVar542 = lVar542 + 1;
      iVar545 = iVar545 + 0x80;
      lVar543 = lVar543 + 0x420;
      uVar548 = *puVar529;
      lVar532 = (long)((int)lVar542 << 7);
      *puVar529 = uVar548 + 1;
      auStack_4038[uVar548 * 2 + lVar532 * 2] = uVar503;
      auStack_4038[uVar548 * 2 + lVar532 * 2 + 1] = uVar501;
    } while (uVar548 + 1 == 0x80);
  }
  lVar542 = 1;
  iVar2 = 0x100;
  local_46c0 = 0;
  iVar1 = 0x80;
  iVar545 = 2;
  local_46d8 = 0x440;
  do {
    uVar503 = auStack_46b8[lVar542];
    uVar531 = 1 << ((uint)lVar542 & 0x1f);
    if ((uVar540 & uVar531) == 0) {
      if (uVar503 != 0) {
        if (uVar503 == 1) {
          lVar542 = (long)(int)((uint)lVar542 << 7);
          uVar503 = auStack_4038[lVar542 * 2];
          if (auStack_4038[lVar542 * 2 + 1] == 0) {
            uVar503 = (uVar503 >> 0x21 ^ uVar503) * -0x3b314601e57a13ad;
            uVar503 = uVar503 >> 0x21 ^ uVar503;
          }
          return uVar503;
        }
        uVar540 = uVar540 | uVar531;
        auStack_46b8[lVar542 + 1] = 0;
        goto LAB_001890e5;
      }
    }
    else if (uVar503 != 0) {
LAB_001890e5:
      prVar3 = this->curr_rd;
      puVar529 = auStack_4038 + (long)iVar1 * 2;
      local_4470 = prVar3[lVar542].const_term;
      local_4710 = 0;
      local_4718 = 0;
      local_4700 = 0;
      local_46f0 = 0;
      local_4708 = local_4470;
      if (uVar503 < 0x40) {
        uVar501 = 0;
        do {
          local_4458 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x20);
          bVar549 = CARRY8(local_4700,local_4458);
          local_4700 = local_4700 + local_4458;
          local_46f0 = local_46f0 + bVar549;
          if (puVar529[1] == 0) {
            local_4468 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x20);
            auVar181._8_8_ = 0;
            auVar181._0_8_ = *puVar529;
            auVar426._8_8_ = 0;
            auVar426._0_8_ = local_4468;
            uVar546 = SUB168(auVar181 * auVar426,8);
            uVar509 = SUB168(auVar181 * auVar426,0);
            uVar548 = local_4710 + uVar546;
            bVar549 = CARRY8(local_4710,uVar546) ||
                      CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
            local_4710 = uVar548 + CARRY8(local_4708,uVar509);
          }
          else {
            local_4460 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x20);
            auVar182._8_8_ = 0;
            auVar182._0_8_ = *puVar529;
            auVar427._8_8_ = 0;
            auVar427._0_8_ = local_4460;
            uVar509 = SUB168(auVar182 * auVar427,0);
            uVar546 = puVar529[1] *
                      *(long *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x20) +
                      SUB168(auVar182 * auVar427,8);
            uVar548 = local_4710 + uVar546;
            bVar549 = CARRY8(local_4710,uVar546) ||
                      CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
            local_4710 = uVar548 + CARRY8(local_4708,uVar509);
          }
          local_4708 = local_4708 + uVar509;
          local_4718 = local_4718 + (ulong)bVar549;
          uVar501 = uVar501 + 1;
          puVar529 = puVar529 + 2;
        } while (uVar503 != uVar501);
        bVar549 = local_4700 <= prVar3[lVar542].cachedSumLow;
        local_4700 = prVar3[lVar542].cachedSumLow - local_4700;
        uVar503 = ~local_46f0;
        if (bVar549) {
          uVar503 = -local_46f0;
        }
        local_46f0 = prVar3[lVar542].cachedSumHigh + uVar503;
      }
      else {
        uVar501 = 0xffffffffffffffff;
        do {
          if (puVar529[1] == 0) {
            local_4448 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x18);
            auVar183._8_8_ = 0;
            auVar183._0_8_ = *puVar529;
            auVar428._8_8_ = 0;
            auVar428._0_8_ = local_4448;
            uVar546 = SUB168(auVar183 * auVar428,8);
            uVar509 = SUB168(auVar183 * auVar428,0);
            uVar548 = local_4710 + uVar546;
            bVar549 = CARRY8(local_4710,uVar546) ||
                      CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
            local_4710 = uVar548 + CARRY8(local_4708,uVar509);
          }
          else {
            local_4440 = *(ulong *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x18);
            auVar184._8_8_ = 0;
            auVar184._0_8_ = *puVar529;
            auVar429._8_8_ = 0;
            auVar429._0_8_ = local_4440;
            uVar509 = SUB168(auVar184 * auVar429,0);
            uVar546 = puVar529[1] *
                      *(long *)((long)prVar3->random_coeff + uVar501 * 8 + local_46d8 + -0x18) +
                      SUB168(auVar184 * auVar429,8);
            uVar548 = local_4710 + uVar546;
            bVar549 = CARRY8(local_4710,uVar546) ||
                      CARRY8(uVar548,(ulong)CARRY8(local_4708,uVar509));
            local_4710 = uVar548 + CARRY8(local_4708,uVar509);
          }
          local_4708 = local_4708 + uVar509;
          local_4718 = local_4718 + (ulong)bVar549;
          lVar543 = (1 - uVar503) + uVar501;
          puVar529 = puVar529 + 2;
          uVar501 = uVar501 + 1;
        } while (lVar543 != -1);
        if (uVar501 < 0x7f) {
          lVar543 = uVar503 + 0x88;
          do {
            local_4450 = *(ulong *)((long)prVar3->random_coeff + lVar543 * 8 + local_46c0 + -0x20);
            lVar543 = lVar543 + 1;
            bVar549 = CARRY8(local_4700,local_4450);
            local_4700 = local_4700 + local_4450;
            local_46f0 = local_46f0 + bVar549;
          } while (lVar543 != 0x108);
        }
      }
      auVar185._8_8_ = 0;
      auVar185._0_8_ = local_4700;
      auVar430._8_8_ = 0;
      auVar430._0_8_ = local_4470;
      uVar548 = SUB168(auVar185 * auVar430,8);
      uVar503 = SUB168(auVar185 * auVar430,0);
      uVar546 = local_4708 + uVar503;
      uVar503 = (ulong)CARRY8(local_4708,uVar503);
      uVar501 = local_4710 + uVar548;
      auVar499._8_8_ = local_4718 + (ulong)(CARRY8(local_4710,uVar548) || CARRY8(uVar501,uVar503));
      auVar499._0_8_ = uVar501 + uVar503;
      local_4478 = local_4470;
      auVar186._8_8_ = 0;
      auVar186._0_8_ = local_46f0;
      auVar431._8_8_ = 0;
      auVar431._0_8_ = local_4470;
      auVar499 = auVar186 * auVar431 + auVar499;
      auVar187._8_8_ = 0;
      auVar187._0_8_ = auVar499._0_8_;
      uVar501 = SUB168(auVar187 * ZEXT816(0xd),0);
      uVar503 = auVar499._8_8_ * 0xa9 + 0xd + SUB168(auVar187 * ZEXT816(0xd),8) * 0xd;
      uVar548 = uVar503 + uVar546;
      uVar509 = uVar548 - uVar501;
      uVar503 = (((ulong)CARRY8(uVar503,uVar546) + 1) - (ulong)(uVar548 < uVar501)) * -0xd + uVar509
      ;
      if ((uVar509 < 0x1a) && (0x19 < uVar503)) {
        bVar549 = 0xfffffffffffffff2 < uVar503;
        uVar503 = uVar503 + 0xd;
        uVar501 = (ulong)bVar549;
      }
      else {
        uVar501 = 0;
      }
      uVar548 = auStack_46b8[lVar542 + 1];
      lVar543 = lVar542 + 1;
      lVar532 = (long)((int)lVar543 << 7);
      auStack_46b8[lVar542 + 1] = uVar548 + 1;
      auStack_4038[uVar548 * 2 + lVar532 * 2] = uVar503;
      auStack_4038[uVar548 * 2 + lVar532 * 2 + 1] = uVar501;
      if (uVar548 + 1 == 0x80) {
        puVar529 = auStack_46b8 + lVar542 + 1;
        lVar500 = (long)iVar545;
        iVar504 = iVar2;
        lVar532 = lVar542;
        do {
          lVar544 = lVar500;
          *puVar529 = 0;
          uVar503 = 0xffffffffffffffe0;
          prVar3 = this->curr_rd;
          plVar530 = local_3e40 + (long)iVar504 * 2;
          local_4708 = prVar3[lVar543].const_term;
          local_4710 = 0;
          local_4718 = 0;
          do {
            if (plVar530[-0x3e] == 0) {
              local_4488 = prVar3[lVar543].random_coeff[uVar503 + 0x20];
              auVar188._8_8_ = 0;
              auVar188._0_8_ = plVar530[-0x3f];
              auVar432._8_8_ = 0;
              auVar432._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x20];
              uVar509 = SUB168(auVar188 * auVar432,8);
              uVar548 = SUB168(auVar188 * auVar432,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4480 = prVar3[lVar543].random_coeff[uVar503 + 0x20];
              auVar220._8_8_ = 0;
              auVar220._0_8_ = plVar530[-0x3f];
              auVar464._8_8_ = 0;
              auVar464._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x20];
              uVar548 = SUB168(auVar220 * auVar464,0);
              uVar509 = plVar530[-0x3e] * prVar3[lVar543].random_coeff[uVar503 + 0x20] +
                        SUB168(auVar220 * auVar464,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x3c] == 0) {
              local_4498 = prVar3[lVar543].random_coeff[uVar503 + 0x21];
              auVar189._8_8_ = 0;
              auVar189._0_8_ = plVar530[-0x3d];
              auVar433._8_8_ = 0;
              auVar433._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x21];
              uVar509 = SUB168(auVar189 * auVar433,8);
              uVar548 = SUB168(auVar189 * auVar433,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4490 = prVar3[lVar543].random_coeff[uVar503 + 0x21];
              auVar221._8_8_ = 0;
              auVar221._0_8_ = plVar530[-0x3d];
              auVar465._8_8_ = 0;
              auVar465._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x21];
              uVar548 = SUB168(auVar221 * auVar465,0);
              uVar509 = plVar530[-0x3c] * prVar3[lVar543].random_coeff[uVar503 + 0x21] +
                        SUB168(auVar221 * auVar465,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x3a] == 0) {
              local_44a8 = prVar3[lVar543].random_coeff[uVar503 + 0x22];
              auVar190._8_8_ = 0;
              auVar190._0_8_ = plVar530[-0x3b];
              auVar434._8_8_ = 0;
              auVar434._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x22];
              uVar509 = SUB168(auVar190 * auVar434,8);
              uVar548 = SUB168(auVar190 * auVar434,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44a0 = prVar3[lVar543].random_coeff[uVar503 + 0x22];
              auVar222._8_8_ = 0;
              auVar222._0_8_ = plVar530[-0x3b];
              auVar466._8_8_ = 0;
              auVar466._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x22];
              uVar548 = SUB168(auVar222 * auVar466,0);
              uVar509 = plVar530[-0x3a] * prVar3[lVar543].random_coeff[uVar503 + 0x22] +
                        SUB168(auVar222 * auVar466,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x38] == 0) {
              local_44b8 = prVar3[lVar543].random_coeff[uVar503 + 0x23];
              auVar191._8_8_ = 0;
              auVar191._0_8_ = plVar530[-0x39];
              auVar435._8_8_ = 0;
              auVar435._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x23];
              uVar509 = SUB168(auVar191 * auVar435,8);
              uVar548 = SUB168(auVar191 * auVar435,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44b0 = prVar3[lVar543].random_coeff[uVar503 + 0x23];
              auVar223._8_8_ = 0;
              auVar223._0_8_ = plVar530[-0x39];
              auVar467._8_8_ = 0;
              auVar467._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x23];
              uVar548 = SUB168(auVar223 * auVar467,0);
              uVar509 = plVar530[-0x38] * prVar3[lVar543].random_coeff[uVar503 + 0x23] +
                        SUB168(auVar223 * auVar467,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x36] == 0) {
              local_44c8 = prVar3[lVar543].random_coeff[uVar503 + 0x24];
              auVar192._8_8_ = 0;
              auVar192._0_8_ = plVar530[-0x37];
              auVar436._8_8_ = 0;
              auVar436._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x24];
              uVar509 = SUB168(auVar192 * auVar436,8);
              uVar548 = SUB168(auVar192 * auVar436,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44c0 = prVar3[lVar543].random_coeff[uVar503 + 0x24];
              auVar224._8_8_ = 0;
              auVar224._0_8_ = plVar530[-0x37];
              auVar468._8_8_ = 0;
              auVar468._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x24];
              uVar548 = SUB168(auVar224 * auVar468,0);
              uVar509 = plVar530[-0x36] * prVar3[lVar543].random_coeff[uVar503 + 0x24] +
                        SUB168(auVar224 * auVar468,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x34] == 0) {
              local_44d8 = prVar3[lVar543].random_coeff[uVar503 + 0x25];
              auVar193._8_8_ = 0;
              auVar193._0_8_ = plVar530[-0x35];
              auVar437._8_8_ = 0;
              auVar437._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x25];
              uVar509 = SUB168(auVar193 * auVar437,8);
              uVar548 = SUB168(auVar193 * auVar437,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44d0 = prVar3[lVar543].random_coeff[uVar503 + 0x25];
              auVar225._8_8_ = 0;
              auVar225._0_8_ = plVar530[-0x35];
              auVar469._8_8_ = 0;
              auVar469._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x25];
              uVar548 = SUB168(auVar225 * auVar469,0);
              uVar509 = plVar530[-0x34] * prVar3[lVar543].random_coeff[uVar503 + 0x25] +
                        SUB168(auVar225 * auVar469,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x32] == 0) {
              local_44e8 = prVar3[lVar543].random_coeff[uVar503 + 0x26];
              auVar194._8_8_ = 0;
              auVar194._0_8_ = plVar530[-0x33];
              auVar438._8_8_ = 0;
              auVar438._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x26];
              uVar509 = SUB168(auVar194 * auVar438,8);
              uVar548 = SUB168(auVar194 * auVar438,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44e0 = prVar3[lVar543].random_coeff[uVar503 + 0x26];
              auVar226._8_8_ = 0;
              auVar226._0_8_ = plVar530[-0x33];
              auVar470._8_8_ = 0;
              auVar470._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x26];
              uVar548 = SUB168(auVar226 * auVar470,0);
              uVar509 = plVar530[-0x32] * prVar3[lVar543].random_coeff[uVar503 + 0x26] +
                        SUB168(auVar226 * auVar470,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x30] == 0) {
              local_44f8 = prVar3[lVar543].random_coeff[uVar503 + 0x27];
              auVar195._8_8_ = 0;
              auVar195._0_8_ = plVar530[-0x31];
              auVar439._8_8_ = 0;
              auVar439._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x27];
              uVar509 = SUB168(auVar195 * auVar439,8);
              uVar548 = SUB168(auVar195 * auVar439,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_44f0 = prVar3[lVar543].random_coeff[uVar503 + 0x27];
              auVar227._8_8_ = 0;
              auVar227._0_8_ = plVar530[-0x31];
              auVar471._8_8_ = 0;
              auVar471._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x27];
              uVar548 = SUB168(auVar227 * auVar471,0);
              uVar509 = plVar530[-0x30] * prVar3[lVar543].random_coeff[uVar503 + 0x27] +
                        SUB168(auVar227 * auVar471,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2e] == 0) {
              local_4508 = prVar3[lVar543].random_coeff[uVar503 + 0x28];
              auVar196._8_8_ = 0;
              auVar196._0_8_ = plVar530[-0x2f];
              auVar440._8_8_ = 0;
              auVar440._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x28];
              uVar509 = SUB168(auVar196 * auVar440,8);
              uVar548 = SUB168(auVar196 * auVar440,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4500 = prVar3[lVar543].random_coeff[uVar503 + 0x28];
              auVar228._8_8_ = 0;
              auVar228._0_8_ = plVar530[-0x2f];
              auVar472._8_8_ = 0;
              auVar472._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x28];
              uVar548 = SUB168(auVar228 * auVar472,0);
              uVar509 = plVar530[-0x2e] * prVar3[lVar543].random_coeff[uVar503 + 0x28] +
                        SUB168(auVar228 * auVar472,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2c] == 0) {
              local_4518 = prVar3[lVar543].random_coeff[uVar503 + 0x29];
              auVar197._8_8_ = 0;
              auVar197._0_8_ = plVar530[-0x2d];
              auVar441._8_8_ = 0;
              auVar441._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x29];
              uVar509 = SUB168(auVar197 * auVar441,8);
              uVar548 = SUB168(auVar197 * auVar441,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4510 = prVar3[lVar543].random_coeff[uVar503 + 0x29];
              auVar229._8_8_ = 0;
              auVar229._0_8_ = plVar530[-0x2d];
              auVar473._8_8_ = 0;
              auVar473._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x29];
              uVar548 = SUB168(auVar229 * auVar473,0);
              uVar509 = plVar530[-0x2c] * prVar3[lVar543].random_coeff[uVar503 + 0x29] +
                        SUB168(auVar229 * auVar473,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x2a] == 0) {
              local_4528 = prVar3[lVar543].random_coeff[uVar503 + 0x2a];
              auVar198._8_8_ = 0;
              auVar198._0_8_ = plVar530[-0x2b];
              auVar442._8_8_ = 0;
              auVar442._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2a];
              uVar509 = SUB168(auVar198 * auVar442,8);
              uVar548 = SUB168(auVar198 * auVar442,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4520 = prVar3[lVar543].random_coeff[uVar503 + 0x2a];
              auVar230._8_8_ = 0;
              auVar230._0_8_ = plVar530[-0x2b];
              auVar474._8_8_ = 0;
              auVar474._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2a];
              uVar548 = SUB168(auVar230 * auVar474,0);
              uVar509 = plVar530[-0x2a] * prVar3[lVar543].random_coeff[uVar503 + 0x2a] +
                        SUB168(auVar230 * auVar474,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x28] == 0) {
              local_4538 = prVar3[lVar543].random_coeff[uVar503 + 0x2b];
              auVar199._8_8_ = 0;
              auVar199._0_8_ = plVar530[-0x29];
              auVar443._8_8_ = 0;
              auVar443._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2b];
              uVar509 = SUB168(auVar199 * auVar443,8);
              uVar548 = SUB168(auVar199 * auVar443,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4530 = prVar3[lVar543].random_coeff[uVar503 + 0x2b];
              auVar231._8_8_ = 0;
              auVar231._0_8_ = plVar530[-0x29];
              auVar475._8_8_ = 0;
              auVar475._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2b];
              uVar548 = SUB168(auVar231 * auVar475,0);
              uVar509 = plVar530[-0x28] * prVar3[lVar543].random_coeff[uVar503 + 0x2b] +
                        SUB168(auVar231 * auVar475,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x26] == 0) {
              local_4548 = prVar3[lVar543].random_coeff[uVar503 + 0x2c];
              auVar200._8_8_ = 0;
              auVar200._0_8_ = plVar530[-0x27];
              auVar444._8_8_ = 0;
              auVar444._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2c];
              uVar509 = SUB168(auVar200 * auVar444,8);
              uVar548 = SUB168(auVar200 * auVar444,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4540 = prVar3[lVar543].random_coeff[uVar503 + 0x2c];
              auVar232._8_8_ = 0;
              auVar232._0_8_ = plVar530[-0x27];
              auVar476._8_8_ = 0;
              auVar476._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2c];
              uVar548 = SUB168(auVar232 * auVar476,0);
              uVar509 = plVar530[-0x26] * prVar3[lVar543].random_coeff[uVar503 + 0x2c] +
                        SUB168(auVar232 * auVar476,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x24] == 0) {
              local_4558 = prVar3[lVar543].random_coeff[uVar503 + 0x2d];
              auVar201._8_8_ = 0;
              auVar201._0_8_ = plVar530[-0x25];
              auVar445._8_8_ = 0;
              auVar445._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2d];
              uVar509 = SUB168(auVar201 * auVar445,8);
              uVar548 = SUB168(auVar201 * auVar445,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4550 = prVar3[lVar543].random_coeff[uVar503 + 0x2d];
              auVar233._8_8_ = 0;
              auVar233._0_8_ = plVar530[-0x25];
              auVar477._8_8_ = 0;
              auVar477._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2d];
              uVar548 = SUB168(auVar233 * auVar477,0);
              uVar509 = plVar530[-0x24] * prVar3[lVar543].random_coeff[uVar503 + 0x2d] +
                        SUB168(auVar233 * auVar477,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x22] == 0) {
              local_4568 = prVar3[lVar543].random_coeff[uVar503 + 0x2e];
              auVar202._8_8_ = 0;
              auVar202._0_8_ = plVar530[-0x23];
              auVar446._8_8_ = 0;
              auVar446._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2e];
              uVar509 = SUB168(auVar202 * auVar446,8);
              uVar548 = SUB168(auVar202 * auVar446,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4560 = prVar3[lVar543].random_coeff[uVar503 + 0x2e];
              auVar234._8_8_ = 0;
              auVar234._0_8_ = plVar530[-0x23];
              auVar478._8_8_ = 0;
              auVar478._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2e];
              uVar548 = SUB168(auVar234 * auVar478,0);
              uVar509 = plVar530[-0x22] * prVar3[lVar543].random_coeff[uVar503 + 0x2e] +
                        SUB168(auVar234 * auVar478,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x20] == 0) {
              local_4578 = prVar3[lVar543].random_coeff[uVar503 + 0x2f];
              auVar203._8_8_ = 0;
              auVar203._0_8_ = plVar530[-0x21];
              auVar447._8_8_ = 0;
              auVar447._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2f];
              uVar509 = SUB168(auVar203 * auVar447,8);
              uVar548 = SUB168(auVar203 * auVar447,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4570 = prVar3[lVar543].random_coeff[uVar503 + 0x2f];
              auVar235._8_8_ = 0;
              auVar235._0_8_ = plVar530[-0x21];
              auVar479._8_8_ = 0;
              auVar479._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x2f];
              uVar548 = SUB168(auVar235 * auVar479,0);
              uVar509 = plVar530[-0x20] * prVar3[lVar543].random_coeff[uVar503 + 0x2f] +
                        SUB168(auVar235 * auVar479,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1e] == 0) {
              local_4588 = prVar3[lVar543].random_coeff[uVar503 + 0x30];
              auVar204._8_8_ = 0;
              auVar204._0_8_ = plVar530[-0x1f];
              auVar448._8_8_ = 0;
              auVar448._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x30];
              uVar509 = SUB168(auVar204 * auVar448,8);
              uVar548 = SUB168(auVar204 * auVar448,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4580 = prVar3[lVar543].random_coeff[uVar503 + 0x30];
              auVar236._8_8_ = 0;
              auVar236._0_8_ = plVar530[-0x1f];
              auVar480._8_8_ = 0;
              auVar480._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x30];
              uVar548 = SUB168(auVar236 * auVar480,0);
              uVar509 = plVar530[-0x1e] * prVar3[lVar543].random_coeff[uVar503 + 0x30] +
                        SUB168(auVar236 * auVar480,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1c] == 0) {
              local_4598 = prVar3[lVar543].random_coeff[uVar503 + 0x31];
              auVar205._8_8_ = 0;
              auVar205._0_8_ = plVar530[-0x1d];
              auVar449._8_8_ = 0;
              auVar449._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x31];
              uVar509 = SUB168(auVar205 * auVar449,8);
              uVar548 = SUB168(auVar205 * auVar449,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4590 = prVar3[lVar543].random_coeff[uVar503 + 0x31];
              auVar237._8_8_ = 0;
              auVar237._0_8_ = plVar530[-0x1d];
              auVar481._8_8_ = 0;
              auVar481._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x31];
              uVar548 = SUB168(auVar237 * auVar481,0);
              uVar509 = plVar530[-0x1c] * prVar3[lVar543].random_coeff[uVar503 + 0x31] +
                        SUB168(auVar237 * auVar481,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x1a] == 0) {
              local_45a8 = prVar3[lVar543].random_coeff[uVar503 + 0x32];
              auVar206._8_8_ = 0;
              auVar206._0_8_ = plVar530[-0x1b];
              auVar450._8_8_ = 0;
              auVar450._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x32];
              uVar509 = SUB168(auVar206 * auVar450,8);
              uVar548 = SUB168(auVar206 * auVar450,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45a0 = prVar3[lVar543].random_coeff[uVar503 + 0x32];
              auVar238._8_8_ = 0;
              auVar238._0_8_ = plVar530[-0x1b];
              auVar482._8_8_ = 0;
              auVar482._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x32];
              uVar548 = SUB168(auVar238 * auVar482,0);
              uVar509 = plVar530[-0x1a] * prVar3[lVar543].random_coeff[uVar503 + 0x32] +
                        SUB168(auVar238 * auVar482,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x18] == 0) {
              local_45b8 = prVar3[lVar543].random_coeff[uVar503 + 0x33];
              auVar207._8_8_ = 0;
              auVar207._0_8_ = plVar530[-0x19];
              auVar451._8_8_ = 0;
              auVar451._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x33];
              uVar509 = SUB168(auVar207 * auVar451,8);
              uVar548 = SUB168(auVar207 * auVar451,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45b0 = prVar3[lVar543].random_coeff[uVar503 + 0x33];
              auVar239._8_8_ = 0;
              auVar239._0_8_ = plVar530[-0x19];
              auVar483._8_8_ = 0;
              auVar483._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x33];
              uVar548 = SUB168(auVar239 * auVar483,0);
              uVar509 = plVar530[-0x18] * prVar3[lVar543].random_coeff[uVar503 + 0x33] +
                        SUB168(auVar239 * auVar483,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x16] == 0) {
              local_45c8 = prVar3[lVar543].random_coeff[uVar503 + 0x34];
              auVar208._8_8_ = 0;
              auVar208._0_8_ = plVar530[-0x17];
              auVar452._8_8_ = 0;
              auVar452._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x34];
              uVar509 = SUB168(auVar208 * auVar452,8);
              uVar548 = SUB168(auVar208 * auVar452,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45c0 = prVar3[lVar543].random_coeff[uVar503 + 0x34];
              auVar240._8_8_ = 0;
              auVar240._0_8_ = plVar530[-0x17];
              auVar484._8_8_ = 0;
              auVar484._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x34];
              uVar548 = SUB168(auVar240 * auVar484,0);
              uVar509 = plVar530[-0x16] * prVar3[lVar543].random_coeff[uVar503 + 0x34] +
                        SUB168(auVar240 * auVar484,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x14] == 0) {
              local_45d8 = prVar3[lVar543].random_coeff[uVar503 + 0x35];
              auVar209._8_8_ = 0;
              auVar209._0_8_ = plVar530[-0x15];
              auVar453._8_8_ = 0;
              auVar453._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x35];
              uVar509 = SUB168(auVar209 * auVar453,8);
              uVar548 = SUB168(auVar209 * auVar453,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45d0 = prVar3[lVar543].random_coeff[uVar503 + 0x35];
              auVar241._8_8_ = 0;
              auVar241._0_8_ = plVar530[-0x15];
              auVar485._8_8_ = 0;
              auVar485._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x35];
              uVar548 = SUB168(auVar241 * auVar485,0);
              uVar509 = plVar530[-0x14] * prVar3[lVar543].random_coeff[uVar503 + 0x35] +
                        SUB168(auVar241 * auVar485,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x12] == 0) {
              local_45e8 = prVar3[lVar543].random_coeff[uVar503 + 0x36];
              auVar210._8_8_ = 0;
              auVar210._0_8_ = plVar530[-0x13];
              auVar454._8_8_ = 0;
              auVar454._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x36];
              uVar509 = SUB168(auVar210 * auVar454,8);
              uVar548 = SUB168(auVar210 * auVar454,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45e0 = prVar3[lVar543].random_coeff[uVar503 + 0x36];
              auVar242._8_8_ = 0;
              auVar242._0_8_ = plVar530[-0x13];
              auVar486._8_8_ = 0;
              auVar486._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x36];
              uVar548 = SUB168(auVar242 * auVar486,0);
              uVar509 = plVar530[-0x12] * prVar3[lVar543].random_coeff[uVar503 + 0x36] +
                        SUB168(auVar242 * auVar486,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0x10] == 0) {
              local_45f8 = prVar3[lVar543].random_coeff[uVar503 + 0x37];
              auVar211._8_8_ = 0;
              auVar211._0_8_ = plVar530[-0x11];
              auVar455._8_8_ = 0;
              auVar455._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x37];
              uVar509 = SUB168(auVar211 * auVar455,8);
              uVar548 = SUB168(auVar211 * auVar455,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_45f0 = prVar3[lVar543].random_coeff[uVar503 + 0x37];
              auVar243._8_8_ = 0;
              auVar243._0_8_ = plVar530[-0x11];
              auVar487._8_8_ = 0;
              auVar487._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x37];
              uVar548 = SUB168(auVar243 * auVar487,0);
              uVar509 = plVar530[-0x10] * prVar3[lVar543].random_coeff[uVar503 + 0x37] +
                        SUB168(auVar243 * auVar487,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0xe] == 0) {
              local_4608 = prVar3[lVar543].random_coeff[uVar503 + 0x38];
              auVar212._8_8_ = 0;
              auVar212._0_8_ = plVar530[-0xf];
              auVar456._8_8_ = 0;
              auVar456._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x38];
              uVar509 = SUB168(auVar212 * auVar456,8);
              uVar548 = SUB168(auVar212 * auVar456,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4600 = prVar3[lVar543].random_coeff[uVar503 + 0x38];
              auVar244._8_8_ = 0;
              auVar244._0_8_ = plVar530[-0xf];
              auVar488._8_8_ = 0;
              auVar488._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x38];
              uVar548 = SUB168(auVar244 * auVar488,0);
              uVar509 = plVar530[-0xe] * prVar3[lVar543].random_coeff[uVar503 + 0x38] +
                        SUB168(auVar244 * auVar488,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-0xc] == 0) {
              local_4618 = prVar3[lVar543].random_coeff[uVar503 + 0x39];
              auVar213._8_8_ = 0;
              auVar213._0_8_ = plVar530[-0xd];
              auVar457._8_8_ = 0;
              auVar457._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x39];
              uVar509 = SUB168(auVar213 * auVar457,8);
              uVar548 = SUB168(auVar213 * auVar457,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4610 = prVar3[lVar543].random_coeff[uVar503 + 0x39];
              auVar245._8_8_ = 0;
              auVar245._0_8_ = plVar530[-0xd];
              auVar489._8_8_ = 0;
              auVar489._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x39];
              uVar548 = SUB168(auVar245 * auVar489,0);
              uVar509 = plVar530[-0xc] * prVar3[lVar543].random_coeff[uVar503 + 0x39] +
                        SUB168(auVar245 * auVar489,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-10] == 0) {
              local_4628 = prVar3[lVar543].random_coeff[uVar503 + 0x3a];
              auVar214._8_8_ = 0;
              auVar214._0_8_ = plVar530[-0xb];
              auVar458._8_8_ = 0;
              auVar458._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3a];
              uVar509 = SUB168(auVar214 * auVar458,8);
              uVar548 = SUB168(auVar214 * auVar458,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4620 = prVar3[lVar543].random_coeff[uVar503 + 0x3a];
              auVar246._8_8_ = 0;
              auVar246._0_8_ = plVar530[-0xb];
              auVar490._8_8_ = 0;
              auVar490._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3a];
              uVar548 = SUB168(auVar246 * auVar490,0);
              uVar509 = plVar530[-10] * prVar3[lVar543].random_coeff[uVar503 + 0x3a] +
                        SUB168(auVar246 * auVar490,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-8] == 0) {
              local_4638 = prVar3[lVar543].random_coeff[uVar503 + 0x3b];
              auVar215._8_8_ = 0;
              auVar215._0_8_ = plVar530[-9];
              auVar459._8_8_ = 0;
              auVar459._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3b];
              uVar509 = SUB168(auVar215 * auVar459,8);
              uVar548 = SUB168(auVar215 * auVar459,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4630 = prVar3[lVar543].random_coeff[uVar503 + 0x3b];
              auVar247._8_8_ = 0;
              auVar247._0_8_ = plVar530[-9];
              auVar491._8_8_ = 0;
              auVar491._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3b];
              uVar548 = SUB168(auVar247 * auVar491,0);
              uVar509 = plVar530[-8] * prVar3[lVar543].random_coeff[uVar503 + 0x3b] +
                        SUB168(auVar247 * auVar491,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-6] == 0) {
              local_4648 = prVar3[lVar543].random_coeff[uVar503 + 0x3c];
              auVar216._8_8_ = 0;
              auVar216._0_8_ = plVar530[-7];
              auVar460._8_8_ = 0;
              auVar460._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3c];
              uVar509 = SUB168(auVar216 * auVar460,8);
              uVar548 = SUB168(auVar216 * auVar460,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4640 = prVar3[lVar543].random_coeff[uVar503 + 0x3c];
              auVar248._8_8_ = 0;
              auVar248._0_8_ = plVar530[-7];
              auVar492._8_8_ = 0;
              auVar492._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3c];
              uVar548 = SUB168(auVar248 * auVar492,0);
              uVar509 = plVar530[-6] * prVar3[lVar543].random_coeff[uVar503 + 0x3c] +
                        SUB168(auVar248 * auVar492,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-4] == 0) {
              local_4658 = prVar3[lVar543].random_coeff[uVar503 + 0x3d];
              auVar217._8_8_ = 0;
              auVar217._0_8_ = plVar530[-5];
              auVar461._8_8_ = 0;
              auVar461._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3d];
              uVar509 = SUB168(auVar217 * auVar461,8);
              uVar548 = SUB168(auVar217 * auVar461,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4650 = prVar3[lVar543].random_coeff[uVar503 + 0x3d];
              auVar249._8_8_ = 0;
              auVar249._0_8_ = plVar530[-5];
              auVar493._8_8_ = 0;
              auVar493._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3d];
              uVar548 = SUB168(auVar249 * auVar493,0);
              uVar509 = plVar530[-4] * prVar3[lVar543].random_coeff[uVar503 + 0x3d] +
                        SUB168(auVar249 * auVar493,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (plVar530[-2] == 0) {
              local_4668 = prVar3[lVar543].random_coeff[uVar503 + 0x3e];
              auVar218._8_8_ = 0;
              auVar218._0_8_ = plVar530[-3];
              auVar462._8_8_ = 0;
              auVar462._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3e];
              uVar509 = SUB168(auVar218 * auVar462,8);
              uVar548 = SUB168(auVar218 * auVar462,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4660 = prVar3[lVar543].random_coeff[uVar503 + 0x3e];
              auVar250._8_8_ = 0;
              auVar250._0_8_ = plVar530[-3];
              auVar494._8_8_ = 0;
              auVar494._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3e];
              uVar548 = SUB168(auVar250 * auVar494,0);
              uVar509 = plVar530[-2] * prVar3[lVar543].random_coeff[uVar503 + 0x3e] +
                        SUB168(auVar250 * auVar494,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            if (*plVar530 == 0) {
              local_4678 = prVar3[lVar543].random_coeff[uVar503 + 0x3f];
              auVar219._8_8_ = 0;
              auVar219._0_8_ = plVar530[-1];
              auVar463._8_8_ = 0;
              auVar463._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3f];
              uVar509 = SUB168(auVar219 * auVar463,8);
              uVar548 = SUB168(auVar219 * auVar463,0);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            else {
              local_4670 = prVar3[lVar543].random_coeff[uVar503 + 0x3f];
              auVar251._8_8_ = 0;
              auVar251._0_8_ = plVar530[-1];
              auVar495._8_8_ = 0;
              auVar495._0_8_ = prVar3[lVar543].random_coeff[uVar503 + 0x3f];
              uVar548 = SUB168(auVar251 * auVar495,0);
              uVar509 = *plVar530 * prVar3[lVar543].random_coeff[uVar503 + 0x3f] +
                        SUB168(auVar251 * auVar495,8);
              uVar501 = local_4710 + uVar509;
              bVar549 = CARRY8(local_4710,uVar509) ||
                        CARRY8(uVar501,(ulong)CARRY8(local_4708,uVar548));
              local_4710 = uVar501 + CARRY8(local_4708,uVar548);
            }
            local_4708 = local_4708 + uVar548;
            local_4718 = local_4718 + (ulong)bVar549;
            uVar503 = uVar503 + 0x20;
            plVar530 = plVar530 + 0x40;
          } while (uVar503 < 0x60);
          auVar252._8_8_ = 0;
          auVar252._0_8_ = local_4710;
          uVar501 = SUB168(auVar252 * ZEXT816(0xd),0);
          uVar503 = local_4718 * 0xa9 + 0xd + SUB168(auVar252 * ZEXT816(0xd),8) * 0xd;
          uVar548 = uVar503 + local_4708;
          uVar509 = uVar548 - uVar501;
          uVar503 = (((ulong)CARRY8(uVar503,local_4708) + 1) - (ulong)(uVar548 < uVar501)) * -0xd +
                    uVar509;
          if ((uVar509 < 0x1a) && (0x19 < uVar503)) {
            bVar549 = 0xfffffffffffffff2 < uVar503;
            uVar503 = uVar503 + 0xd;
            uVar501 = (ulong)bVar549;
          }
          else {
            uVar501 = 0;
          }
          uVar531 = 2 << ((uint)lVar532 & 0x1f);
          if ((uVar540 & uVar531) == 0) {
            uVar540 = uVar540 | uVar531;
            puVar529[1] = 0;
          }
          puVar529 = auStack_46b8 + lVar544 + 1;
          lVar543 = lVar544 + 1;
          iVar504 = iVar504 + 0x80;
          uVar548 = *puVar529;
          lVar532 = (long)((int)lVar543 << 7);
          *puVar529 = uVar548 + 1;
          auStack_4038[uVar548 * 2 + lVar532 * 2] = uVar503;
          auStack_4038[uVar548 * 2 + lVar532 * 2 + 1] = uVar501;
          lVar500 = lVar543;
          lVar532 = lVar544;
        } while (uVar548 + 1 == 0x80);
      }
    }
    iVar545 = iVar545 + 1;
    lVar542 = lVar542 + 1;
    iVar1 = iVar1 + 0x80;
    local_46d8 = local_46d8 + 0x420;
    local_46c0 = local_46c0 + 0x420;
    iVar2 = iVar2 + 0x80;
  } while( true );
}

Assistant:

NOINLINE uint64_t _hash_noRecursionNoInline_type2( const unsigned char* chars, std::size_t cnt ) const
  {
			_ULARGELARGE_INTEGER__XX allValues[ PMPML_LEVELS_64 * PMPML_CHUNK_SIZE_64 ];
			std::size_t cnts[ PMPML_LEVELS_64 ];
			std::size_t flag;
			cnts[ 1 ] = 0;
			flag = 0;

			std::size_t i;
			_ULARGELARGE_INTEGER__XX tmp_hash;
			// process full chunks
			for ( i=0; i<(cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2_64); i++ )
			{
				hash_of_string_chunk_compact( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), ((const uint64_t*)(chars)) + ( i << PMPML_CHUNK_SIZE_LOG2_64 ), tmp_hash );
				procesNextValue( 1, tmp_hash, allValues, cnts, flag );
			}
			// process remaining incomplete chunk(s)
			// note: if string size is a multiple of chunk size, we create a new chunk (1,0,0,...0),
			// so THIS PROCESSING IS ALWAYS PERFORMED
			std::size_t tailCnt = cnt & ( PMPML_CHUNK_SIZE_BYTES_64 - 1 );
			const unsigned char* tail = chars + ( (cnt>>PMPML_CHUNK_SIZE_BYTES_LOG2_64) << PMPML_CHUNK_SIZE_BYTES_LOG2_64 );
			hash_of_beginning_of_string_chunk_type2( curr_rd[0].random_coeff, *(ULARGE_INTEGER__XX*)(&(curr_rd[0].const_term)), tail, tailCnt, tmp_hash );
			procesNextValue( 1, tmp_hash, allValues, cnts, flag );
			_ULARGELARGE_INTEGER__XX finRet = finalize( 1, allValues, cnts, flag );
			if ( finRet.HighPart == 0 ) //LIKELY
			{
				return fmix64_short( finRet.LowPart );
			}
			return finRet.LowPart;
  }